

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

void * stbi__load_main(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri,
                      int bpc)

{
  anon_struct_96_18_0d0905d3 *paVar1;
  byte bVar2;
  short sVar3;
  stbi__uint32 b;
  stbi_uc asVar4 [4];
  stbi_uc asVar5 [4];
  int iVar6;
  undefined8 uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  int iVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  stbi_uc sVar36;
  byte bVar37;
  uchar uVar38;
  int iVar39;
  stbi__uint32 sVar40;
  uint uVar41;
  int iVar42;
  int iVar43;
  stbi__jpeg *psVar44;
  long lVar45;
  ulong uVar46;
  stbi__uint16 *data_00;
  stbi__context *psVar47;
  uchar *data_01;
  void *pvVar48;
  code *pcVar49;
  stbi__context *psVar50;
  float *data_02;
  stbi_uc *psVar51;
  byte *pbVar52;
  long lVar53;
  uint extraout_EDX;
  uint extraout_EDX_00;
  uint uVar54;
  uint uVar55;
  uint uVar56;
  int iVar57;
  uint extraout_EDX_01;
  uint extraout_EDX_02;
  int why;
  anon_struct_96_18_0d0905d3 *extraout_RDX;
  anon_struct_96_18_0d0905d3 *extraout_RDX_00;
  anon_struct_96_18_0d0905d3 *extraout_RDX_01;
  anon_struct_96_18_0d0905d3 *paVar58;
  ulong extraout_RDX_02;
  ulong extraout_RDX_03;
  ulong extraout_RDX_04;
  ulong extraout_RDX_05;
  ulong extraout_RDX_06;
  ulong extraout_RDX_07;
  ulong extraout_RDX_08;
  ulong extraout_RDX_09;
  ulong extraout_RDX_10;
  ulong extraout_RDX_11;
  ulong extraout_RDX_12;
  ulong extraout_RDX_13;
  ulong extraout_RDX_14;
  ulong extraout_RDX_15;
  undefined8 extraout_RDX_16;
  undefined7 uVar59;
  short sVar60;
  ulong uVar61;
  ulong uVar62;
  uint uVar63;
  stbi_uc *psVar64;
  stbi_uc *psVar65;
  short *psVar66;
  undefined4 in_register_00000084;
  long lVar67;
  int iVar68;
  stbi__result_info *ri_00;
  int iVar69;
  int iVar70;
  uchar *puVar71;
  stbi_uc (*pasVar72) [4];
  int *piVar73;
  uint uVar74;
  stbi__uint16 *psVar75;
  bool bVar76;
  undefined1 auVar77 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  int iVar115;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar116 [16];
  stbi_uc *coutput [4];
  short data [64];
  ulong local_89b0;
  uint local_8990;
  ulong local_8978;
  int local_8964;
  stbi__bmp_data local_8948;
  int *local_8920;
  uint local_8918;
  int local_8914;
  undefined8 local_8910;
  uint local_8904;
  stbi_uc *local_8900;
  int *local_88f8;
  ulong local_88f0;
  long local_88e8;
  stbi__uint32 local_88e0;
  int local_88dc;
  int local_88d8;
  int local_88d4;
  int local_88d0;
  int local_88cc;
  int local_88c8;
  int local_88c4;
  ulong local_88c0;
  ulong local_88b8;
  ulong local_88b0;
  stbi__gif local_88a8;
  
  psVar65 = (stbi_uc *)CONCAT44(in_register_00000084,req_comp);
  ri->channel_order = 0;
  ri->bits_per_channel = 8;
  ri->num_channels = 0;
  ri_00 = ri;
  local_8920 = comp;
  psVar44 = (stbi__jpeg *)malloc(0x4888);
  psVar44->s = s;
  psVar44->idct_block_kernel = stbi__idct_simd;
  psVar44->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
  psVar44->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
  psVar44->jfif = 0;
  psVar44->app14_color_transform = -1;
  psVar44->marker = 0xff;
  sVar36 = stbi__get_marker(psVar44);
  if (sVar36 != 0xd8) {
    stbi__g_failure_reason = "no SOI";
  }
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  free(psVar44);
  if (sVar36 == 0xd8) {
    psVar44 = (stbi__jpeg *)malloc(0x4888);
    psVar44->s = s;
    psVar44->idct_block_kernel = stbi__idct_simd;
    psVar44->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
    psVar44->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
    s->img_n = 0;
    if ((uint)req_comp < 5) {
      paVar1 = psVar44->img_comp;
      lVar45 = 0x46d8;
      do {
        psVar65 = psVar44->huff_dc[0].fast + lVar45 + -8;
        psVar65[0] = '\0';
        psVar65[1] = '\0';
        psVar65[2] = '\0';
        psVar65[3] = '\0';
        psVar65[4] = '\0';
        psVar65[5] = '\0';
        psVar65[6] = '\0';
        psVar65[7] = '\0';
        psVar65[8] = '\0';
        psVar65[9] = '\0';
        psVar65[10] = '\0';
        psVar65[0xb] = '\0';
        psVar65[0xc] = '\0';
        psVar65[0xd] = '\0';
        psVar65[0xe] = '\0';
        psVar65[0xf] = '\0';
        lVar45 = lVar45 + 0x60;
      } while (lVar45 != 0x4858);
      psVar44->restart_interval = 0;
      iVar39 = stbi__decode_jpeg_header(psVar44,0);
      uVar74 = extraout_EDX;
      if (iVar39 != 0) {
        bVar37 = stbi__get_marker(psVar44);
        local_88f8 = psVar44->huff_ac[0].delta + 9;
LAB_0010c656:
        if (bVar37 == 0xda) {
          iVar39 = stbi__get16be(psVar44->s);
          psVar47 = psVar44->s;
          pbVar52 = psVar47->img_buffer;
          paVar58 = extraout_RDX_00;
          if (pbVar52 < psVar47->img_buffer_end) {
LAB_0010c749:
            psVar47->img_buffer = pbVar52 + 1;
            bVar37 = *pbVar52;
          }
          else {
            if (psVar47->read_from_callbacks != 0) {
              psVar65 = psVar47->buffer_start;
              iVar70 = (*(psVar47->io).read)(psVar47->io_user_data,(char *)psVar65,psVar47->buflen);
              if (iVar70 == 0) {
                psVar47->read_from_callbacks = 0;
                psVar47->img_buffer = psVar65;
                psVar47->img_buffer_end = psVar47->buffer_start + 1;
                psVar47->buffer_start[0] = '\0';
              }
              else {
                psVar47->img_buffer = psVar65;
                psVar47->img_buffer_end = psVar65 + iVar70;
              }
              pbVar52 = psVar47->img_buffer;
              paVar58 = extraout_RDX_01;
              goto LAB_0010c749;
            }
            bVar37 = 0;
          }
          psVar44->scan_n = (uint)bVar37;
          if ((0xfb < (byte)(bVar37 - 5)) && ((int)(uint)bVar37 <= psVar44->s->img_n)) {
            if (iVar39 != (uint)bVar37 * 2 + 6) {
              stbi__g_failure_reason = "bad SOS len";
              goto LAB_0010ea6d;
            }
            if (bVar37 != 0) {
              lVar45 = 0;
              do {
                psVar47 = psVar44->s;
                pbVar52 = psVar47->img_buffer;
                if (pbVar52 < psVar47->img_buffer_end) {
LAB_0010c806:
                  psVar47->img_buffer = pbVar52 + 1;
                  uVar63 = (uint)*pbVar52;
                }
                else {
                  if (psVar47->read_from_callbacks != 0) {
                    psVar65 = psVar47->buffer_start;
                    iVar39 = (*(psVar47->io).read)
                                       (psVar47->io_user_data,(char *)psVar65,psVar47->buflen);
                    if (iVar39 == 0) {
                      psVar47->read_from_callbacks = 0;
                      psVar47->img_buffer = psVar65;
                      psVar47->img_buffer_end = psVar47->buffer_start + 1;
                      psVar47->buffer_start[0] = '\0';
                    }
                    else {
                      psVar47->img_buffer = psVar65;
                      psVar47->img_buffer_end = psVar65 + iVar39;
                    }
                    pbVar52 = psVar47->img_buffer;
                    goto LAB_0010c806;
                  }
                  uVar63 = 0;
                }
                psVar47 = psVar44->s;
                pbVar52 = psVar47->img_buffer;
                if (pbVar52 < psVar47->img_buffer_end) {
LAB_0010c889:
                  psVar47->img_buffer = pbVar52 + 1;
                  bVar37 = *pbVar52;
                }
                else {
                  if (psVar47->read_from_callbacks != 0) {
                    psVar65 = psVar47->buffer_start;
                    iVar39 = (*(psVar47->io).read)
                                       (psVar47->io_user_data,(char *)psVar65,psVar47->buflen);
                    if (iVar39 == 0) {
                      psVar47->read_from_callbacks = 0;
                      psVar47->img_buffer = psVar65;
                      psVar47->img_buffer_end = psVar47->buffer_start + 1;
                      psVar47->buffer_start[0] = '\0';
                    }
                    else {
                      psVar47->img_buffer = psVar65;
                      psVar47->img_buffer_end = psVar65 + iVar39;
                    }
                    pbVar52 = psVar47->img_buffer;
                    goto LAB_0010c889;
                  }
                  bVar37 = 0;
                }
                uVar74 = psVar44->s->img_n;
                if ((int)uVar74 < 1) {
                  uVar61 = 0;
                }
                else {
                  uVar61 = 0;
                  paVar58 = paVar1;
                  do {
                    if (paVar58->id == uVar63) goto LAB_0010c8bb;
                    uVar61 = uVar61 + 1;
                    paVar58 = paVar58 + 1;
                  } while (uVar74 != uVar61);
                  uVar61 = (ulong)uVar74;
                }
LAB_0010c8bb:
                if ((uint)uVar61 == uVar74) goto LAB_0010ea74;
                uVar62 = uVar61 & 0xffffffff;
                paVar58 = (anon_struct_96_18_0d0905d3 *)(uVar62 * 0x60);
                psVar44->img_comp[uVar62].hd = (uint)(bVar37 >> 4);
                if (0x3f < bVar37) {
                  stbi__g_failure_reason = "bad DC huff";
                  goto LAB_0010ea6d;
                }
                paVar58 = paVar1 + uVar62;
                paVar58->ha = bVar37 & 0xf;
                if (3 < (bVar37 & 0xf)) {
                  stbi__g_failure_reason = "bad AC huff";
                  goto LAB_0010ea6d;
                }
                psVar44->order[lVar45] = (uint)uVar61;
                lVar45 = lVar45 + 1;
              } while (lVar45 < psVar44->scan_n);
            }
            psVar47 = psVar44->s;
            pbVar52 = psVar47->img_buffer;
            if (pbVar52 < psVar47->img_buffer_end) {
LAB_0010c985:
              psVar47->img_buffer = pbVar52 + 1;
              uVar74 = (uint)*pbVar52;
            }
            else {
              if (psVar47->read_from_callbacks != 0) {
                psVar65 = psVar47->buffer_start;
                iVar39 = (*(psVar47->io).read)
                                   (psVar47->io_user_data,(char *)psVar65,psVar47->buflen);
                if (iVar39 == 0) {
                  psVar47->read_from_callbacks = 0;
                  psVar47->img_buffer = psVar65;
                  psVar47->img_buffer_end = psVar47->buffer_start + 1;
                  psVar47->buffer_start[0] = '\0';
                }
                else {
                  psVar47->img_buffer = psVar65;
                  psVar47->img_buffer_end = psVar65 + iVar39;
                }
                pbVar52 = psVar47->img_buffer;
                goto LAB_0010c985;
              }
              uVar74 = 0;
            }
            psVar44->spec_start = uVar74;
            psVar47 = psVar44->s;
            pbVar52 = psVar47->img_buffer;
            if (pbVar52 < psVar47->img_buffer_end) {
LAB_0010ca0e:
              psVar47->img_buffer = pbVar52 + 1;
              uVar74 = (uint)*pbVar52;
            }
            else {
              if (psVar47->read_from_callbacks != 0) {
                psVar65 = psVar47->buffer_start;
                iVar39 = (*(psVar47->io).read)
                                   (psVar47->io_user_data,(char *)psVar65,psVar47->buflen);
                if (iVar39 == 0) {
                  psVar47->read_from_callbacks = 0;
                  psVar47->img_buffer = psVar65;
                  psVar47->img_buffer_end = psVar47->buffer_start + 1;
                  psVar47->buffer_start[0] = '\0';
                }
                else {
                  psVar47->img_buffer = psVar65;
                  psVar47->img_buffer_end = psVar65 + iVar39;
                }
                pbVar52 = psVar47->img_buffer;
                goto LAB_0010ca0e;
              }
              uVar74 = 0;
            }
            psVar44->spec_end = uVar74;
            psVar47 = psVar44->s;
            pbVar52 = psVar47->img_buffer;
            if (pbVar52 < psVar47->img_buffer_end) {
LAB_0010ca97:
              psVar47->img_buffer = pbVar52 + 1;
              bVar37 = *pbVar52;
            }
            else {
              if (psVar47->read_from_callbacks != 0) {
                psVar65 = psVar47->buffer_start;
                iVar39 = (*(psVar47->io).read)
                                   (psVar47->io_user_data,(char *)psVar65,psVar47->buflen);
                if (iVar39 == 0) {
                  psVar47->read_from_callbacks = 0;
                  psVar47->img_buffer = psVar65;
                  psVar47->img_buffer_end = psVar47->buffer_start + 1;
                  psVar47->buffer_start[0] = '\0';
                }
                else {
                  psVar47->img_buffer = psVar65;
                  psVar47->img_buffer_end = psVar65 + iVar39;
                }
                pbVar52 = psVar47->img_buffer;
                goto LAB_0010ca97;
              }
              bVar37 = 0;
            }
            psVar44->succ_high = (uint)(bVar37 >> 4);
            uVar74 = bVar37 & 0xf;
            paVar58 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar74;
            psVar44->succ_low = uVar74;
            iVar39 = psVar44->progressive;
            iVar70 = psVar44->spec_start;
            if (iVar39 == 0) {
              if (((iVar70 != 0) || (0xf < bVar37)) || ((bVar37 & 0xf) != 0)) goto LAB_0010e014;
              psVar44->spec_end = 0x3f;
            }
            else if (((0x3f < iVar70) || (0x3f < psVar44->spec_end)) ||
                    ((psVar44->spec_end < iVar70 || ((0xdf < bVar37 || (0xd < uVar74)))))) {
LAB_0010e014:
              stbi__g_failure_reason = "bad SOS";
              goto LAB_0010ea6d;
            }
            iVar70 = psVar44->scan_n;
            uVar61 = (ulong)(uint)psVar44->restart_interval;
            if (psVar44->restart_interval == 0) {
              uVar61 = 0x7fffffff;
            }
            psVar44->code_buffer = 0;
            psVar44->code_bits = 0;
            psVar44->nomore = 0;
            psVar44->img_comp[3].dc_pred = 0;
            psVar44->img_comp[2].dc_pred = 0;
            psVar44->img_comp[1].dc_pred = 0;
            psVar44->img_comp[0].dc_pred = 0;
            psVar44->marker = 0xff;
            uVar74 = (uint)uVar61;
            psVar44->todo = uVar74;
            psVar44->eob_run = 0;
            if (iVar39 == 0) {
              if (iVar70 == 1) {
                iVar39 = psVar44->order[0];
                uVar63 = psVar44->img_comp[iVar39].y + 7 >> 3;
                local_8978 = (ulong)uVar63;
                if (0 < (int)uVar63) {
                  uVar56 = paVar1[iVar39].x + 7 >> 3;
                  iVar70 = 0;
                  uVar54 = 0;
                  do {
                    if (0 < (int)uVar56) {
                      lVar45 = 0;
                      do {
                        iVar68 = stbi__jpeg_decode_block
                                           (psVar44,(short *)&local_88a8,
                                            (stbi__huffman *)
                                            psVar44->huff_dc[paVar1[iVar39].hd].fast,
                                            (stbi__huffman *)
                                            psVar44->huff_ac[paVar1[iVar39].ha].fast,
                                            psVar44->fast_ac[paVar1[iVar39].ha],iVar39,
                                            psVar44->dequant[paVar1[iVar39].tq]);
                        if (iVar68 == 0) {
                          bVar76 = false;
                          local_89b0 = 0;
                          uVar61 = extraout_RDX_07;
                        }
                        else {
                          (*psVar44->idct_block_kernel)
                                    (paVar1[iVar39].data + lVar45 + iVar70 * paVar1[iVar39].w2,
                                     paVar1[iVar39].w2,(short *)&local_88a8);
                          iVar68 = psVar44->todo;
                          psVar44->todo = iVar68 + -1;
                          bVar76 = true;
                          uVar61 = extraout_RDX_08;
                          if (iVar68 < 2) {
                            if (psVar44->code_bits < 0x18) {
                              stbi__grow_buffer_unsafe(psVar44);
                              uVar61 = extraout_RDX_09;
                            }
                            if ((psVar44->marker & 0xf8) == 0xd0) {
                              psVar44->code_buffer = 0;
                              psVar44->code_bits = 0;
                              psVar44->nomore = 0;
                              psVar44->img_comp[3].dc_pred = 0;
                              psVar44->img_comp[2].dc_pred = 0;
                              psVar44->img_comp[1].dc_pred = 0;
                              psVar44->img_comp[0].dc_pred = 0;
                              psVar44->marker = 0xff;
                              iVar68 = psVar44->restart_interval;
                              uVar61 = 0x7fffffff;
                              if (iVar68 == 0) {
                                iVar68 = 0x7fffffff;
                              }
                              psVar44->todo = iVar68;
                              psVar44->eob_run = 0;
                            }
                            else {
                              local_89b0 = 1;
                              bVar76 = false;
                            }
                          }
                        }
                        uVar74 = (uint)uVar61;
                        if (!bVar76) {
                          iVar39 = (int)local_89b0;
                          goto LAB_0010d9e0;
                        }
                        lVar45 = lVar45 + 8;
                      } while ((ulong)uVar56 * 8 - lVar45 != 0);
                    }
                    uVar74 = (uint)uVar61;
                    uVar54 = uVar54 + 1;
                    iVar70 = iVar70 + 8;
                  } while (uVar54 != uVar63);
                }
LAB_0010d79b:
                iVar39 = 1;
              }
              else {
                iVar39 = 1;
                if (0 < psVar44->img_mcu_y) {
                  iVar70 = 0;
                  do {
                    if (0 < psVar44->img_mcu_x) {
                      iVar68 = 0;
                      do {
                        if (0 < psVar44->scan_n) {
                          lVar45 = 0;
                          do {
                            iVar39 = psVar44->order[lVar45];
                            local_89b0 = (ulong)iVar39;
                            if (0 < psVar44->img_comp[local_89b0].v) {
                              iVar69 = 0;
                              bVar76 = true;
                              do {
                                local_8978 = CONCAT71(local_8978._1_7_,bVar76);
                                iVar42 = paVar1[local_89b0].h;
                                if (0 < iVar42) {
                                  iVar57 = 0;
                                  do {
                                    iVar115 = paVar1[local_89b0].v;
                                    iVar43 = stbi__jpeg_decode_block
                                                       (psVar44,(short *)&local_88a8,
                                                        (stbi__huffman *)
                                                        psVar44->huff_dc[paVar1[local_89b0].hd].fast
                                                        ,(stbi__huffman *)
                                                         psVar44->huff_ac[paVar1[local_89b0].ha].
                                                         fast,psVar44->fast_ac
                                                              [paVar1[local_89b0].ha],iVar39,
                                                        psVar44->dequant[paVar1[local_89b0].tq]);
                                    uVar74 = (uint)extraout_RDX_11;
                                    if (iVar43 == 0) {
                                      uVar61 = extraout_RDX_11;
                                      if (bVar76 != false) goto LAB_0010d9cd;
                                      goto LAB_0010d8f8;
                                    }
                                    (*psVar44->idct_block_kernel)
                                              (paVar1[local_89b0].data +
                                               (long)((iVar42 * iVar68 + iVar57) * 8) +
                                               (long)((iVar115 * iVar70 + iVar69) *
                                                      paVar1[local_89b0].w2 * 8),
                                               paVar1[local_89b0].w2,(short *)&local_88a8);
                                    iVar57 = iVar57 + 1;
                                    iVar42 = paVar1[local_89b0].h;
                                    uVar61 = extraout_RDX_12;
                                  } while (iVar57 < iVar42);
                                }
                                iVar69 = iVar69 + 1;
                                bVar76 = iVar69 < paVar1[local_89b0].v;
                              } while (iVar69 < paVar1[local_89b0].v);
                            }
LAB_0010d8f8:
                            lVar45 = lVar45 + 1;
                          } while (lVar45 < psVar44->scan_n);
                        }
                        uVar74 = (uint)uVar61;
                        iVar69 = psVar44->todo;
                        psVar44->todo = iVar69 + -1;
                        iVar39 = 1;
                        if (iVar69 < 2) {
                          if (psVar44->code_bits < 0x18) {
                            stbi__grow_buffer_unsafe(psVar44);
                            uVar74 = extraout_EDX_02;
                          }
                          if ((psVar44->marker & 0xf8) != 0xd0) goto LAB_0010d9e0;
                          psVar44->code_buffer = 0;
                          psVar44->code_bits = 0;
                          psVar44->nomore = 0;
                          psVar44->img_comp[3].dc_pred = 0;
                          psVar44->img_comp[2].dc_pred = 0;
                          psVar44->img_comp[1].dc_pred = 0;
                          psVar44->img_comp[0].dc_pred = 0;
                          psVar44->marker = 0xff;
                          iVar39 = psVar44->restart_interval;
                          uVar61 = 0x7fffffff;
                          if (iVar39 == 0) {
                            iVar39 = 0x7fffffff;
                          }
                          psVar44->todo = iVar39;
                          psVar44->eob_run = 0;
                        }
                        iVar68 = iVar68 + 1;
                      } while (iVar68 < psVar44->img_mcu_x);
                    }
                    uVar74 = (uint)uVar61;
                    iVar39 = 1;
                    iVar70 = iVar70 + 1;
                  } while (iVar70 < psVar44->img_mcu_y);
                }
              }
            }
            else if (iVar70 == 1) {
              local_88e8 = (long)psVar44->order[0];
              iVar70 = psVar44->img_comp[local_88e8].y + 7 >> 3;
              iVar39 = 1;
              local_88f0 = CONCAT44(local_88f0._4_4_,iVar70);
              if (0 < iVar70) {
                paVar58 = paVar1 + local_88e8;
                iVar68 = psVar44->img_comp[local_88e8].x + 7 >> 3;
                iVar70 = 0;
                local_8910 = paVar58;
                do {
                  if (0 < iVar68) {
                    iVar39 = 0;
                    do {
                      piVar73 = local_88f8;
                      psVar66 = paVar58->coeff + (paVar58->coeff_w * iVar70 + iVar39) * 0x40;
                      uVar62 = (ulong)psVar44->spec_start;
                      if (uVar62 == 0) {
                        iVar69 = stbi__jpeg_decode_block_prog_dc
                                           (psVar44,psVar66,
                                            (stbi__huffman *)psVar44->huff_dc[paVar58->hd].fast,
                                            (int)local_88e8);
                        uVar61 = extraout_RDX_03;
                        if (iVar69 != 0) goto LAB_0010d06e;
                        bVar76 = false;
                        local_8978 = 0;
                      }
                      else {
                        lVar45 = (long)paVar58->ha;
                        local_89b0 = (ulong)(uint)psVar44->succ_low;
                        iVar69 = psVar44->eob_run;
                        bVar37 = (byte)psVar44->succ_low;
                        if (psVar44->succ_high == 0) {
                          if (iVar69 == 0) {
                            do {
                              if (psVar44->code_bits < 0x10) {
                                stbi__grow_buffer_unsafe(psVar44);
                              }
                              sVar60 = psVar44->fast_ac[lVar45][psVar44->code_buffer >> 0x17];
                              uVar74 = (uint)sVar60;
                              iVar69 = (int)uVar62;
                              if (sVar60 == 0) {
                                if (psVar44->code_bits < 0x10) {
                                  stbi__grow_buffer_unsafe(psVar44);
                                }
                                uVar74 = psVar44->code_buffer;
                                uVar46 = (ulong)uVar74;
                                uVar61 = (ulong)psVar44->huff_ac[lVar45].fast[uVar74 >> 0x17];
                                if (uVar61 == 0xff) {
                                  lVar53 = 0;
                                  do {
                                    lVar67 = lVar53;
                                    lVar53 = lVar67 + 1;
                                  } while ((uint)piVar73[lVar45 * 0x1a4 + lVar67 + -0x11] <=
                                           uVar74 >> 0x10);
                                  iVar42 = psVar44->code_bits;
                                  if (lVar53 == 8) {
                                    psVar44->code_bits = iVar42 + -0x10;
                                    uVar63 = 0xffffffff;
                                  }
                                  else {
                                    uVar63 = 0xffffffff;
                                    if ((int)(lVar67 + 10) <= iVar42) {
                                      uVar63 = stbi__bmask[lVar67 + 10];
                                      iVar57 = piVar73[lVar45 * 0x1a4 + lVar53];
                                      uVar56 = uVar74 << ((byte)(lVar67 + 10) & 0x1f);
                                      psVar44->code_bits = (iVar42 - (int)lVar53) + -9;
                                      psVar44->code_buffer = uVar56;
                                      uVar61 = (ulong)(int)((uVar74 >> (0x17U - (char)lVar53 & 0x1f)
                                                            & uVar63) + iVar57);
                                      goto LAB_0010d29e;
                                    }
                                  }
                                }
                                else {
                                  bVar2 = psVar44->huff_ac[lVar45].size[uVar61];
                                  uVar63 = 0xffffffff;
                                  if ((int)(uint)bVar2 <= psVar44->code_bits) {
                                    uVar56 = uVar74 << (bVar2 & 0x1f);
                                    psVar44->code_buffer = uVar56;
                                    psVar44->code_bits = psVar44->code_bits - (uint)bVar2;
LAB_0010d29e:
                                    uVar46 = (ulong)uVar56;
                                    uVar63 = (uint)psVar44->huff_ac[lVar45].values[uVar61];
                                  }
                                }
                                if ((int)uVar63 < 0) {
                                  stbi__g_failure_reason = "bad huffman code";
                                  iVar42 = 1;
                                }
                                else {
                                  uVar74 = uVar63 >> 4;
                                  uVar56 = uVar63 & 0xf;
                                  if (uVar56 != 0) {
                                    bVar2 = ""[(long)iVar69 + (ulong)uVar74];
                                    if (psVar44->code_bits < (int)uVar56) {
                                      stbi__grow_buffer_unsafe(psVar44);
                                    }
                                    uVar63 = psVar44->code_buffer;
                                    uVar41 = uVar63 << (sbyte)uVar56 |
                                             uVar63 >> 0x20 - (sbyte)uVar56;
                                    uVar54 = *(uint *)((long)stbi__bmask + (ulong)(uVar56 * 4));
                                    psVar44->code_buffer = ~uVar54 & uVar41;
                                    psVar44->code_bits = psVar44->code_bits - uVar56;
                                    iVar42 = 0;
                                    iVar57 = 0;
                                    if (-1 < (int)uVar63) {
                                      iVar57 = *(int *)((long)stbi__jbias + (ulong)(uVar56 * 4));
                                    }
                                    iVar57 = (uVar41 & uVar54) + iVar57 << (bVar37 & 0x1f);
                                    uVar62 = (ulong)((int)((long)iVar69 + (ulong)uVar74) + 1);
                                    psVar66[bVar2] = (short)iVar57;
                                    uVar61 = CONCAT71((uint7)(uint3)((uint)iVar57 >> 8),1);
                                    goto LAB_0010d3ec;
                                  }
                                  if (0xef < uVar63) {
                                    uVar63 = iVar69 + 0x10;
                                    goto LAB_0010d1b6;
                                  }
                                  psVar44->eob_run = 1 << ((byte)uVar74 & 0x1f);
                                  if (0xf < uVar63) {
                                    if (psVar44->code_bits < (int)uVar74) {
                                      stbi__grow_buffer_unsafe(psVar44);
                                    }
                                    bVar2 = (byte)uVar74 & 0x1f;
                                    uVar56 = psVar44->code_buffer << bVar2 |
                                             psVar44->code_buffer >> 0x20 - bVar2;
                                    uVar63 = stbi__bmask[uVar74];
                                    psVar44->code_buffer = ~uVar63 & uVar56;
                                    psVar44->code_bits = psVar44->code_bits - uVar74;
                                    psVar44->eob_run = psVar44->eob_run + (uVar56 & uVar63);
                                  }
                                  psVar44->eob_run = psVar44->eob_run + -1;
                                  iVar42 = 2;
                                }
                                uVar61 = 0;
                              }
                              else {
                                psVar44->code_buffer = psVar44->code_buffer << (sbyte)(uVar74 & 0xf)
                                ;
                                uVar46 = (ulong)(uVar74 >> 4 & 0xf);
                                psVar44->code_bits = psVar44->code_bits - (uVar74 & 0xf);
                                uVar63 = (int)((long)iVar69 + uVar46) + 1;
                                psVar66[""[(long)iVar69 + uVar46]] =
                                     (short)((uVar74 >> 8) << (bVar37 & 0x1f));
LAB_0010d1b6:
                                uVar62 = (ulong)uVar63;
                                iVar42 = 0;
                                uVar61 = CONCAT71((int7)(uVar46 >> 8),1);
                              }
LAB_0010d3ec:
                              bVar76 = false;
                              uVar46 = 1;
                              if (iVar42 != 0) {
                                bVar76 = false;
                                if (iVar42 != 2) {
                                  uVar46 = uVar61;
                                  bVar76 = false;
                                }
                                break;
                              }
                            } while ((int)uVar62 <= psVar44->spec_end);
                          }
                          else {
                            psVar44->eob_run = iVar69 + -1;
                            uVar46 = 0;
                            bVar76 = true;
                          }
                          if ((char)uVar46 != '\0') goto LAB_0010d044;
                        }
                        else {
                          if (iVar69 == 0) {
                            uVar74 = (0x10000 << (bVar37 & 0x1f)) >> 0x10;
                            do {
                              if (psVar44->code_bits < 0x10) {
                                stbi__grow_buffer_unsafe(psVar44);
                              }
                              uVar63 = psVar44->code_buffer;
                              uVar61 = (ulong)uVar63;
                              uVar46 = (ulong)psVar44->huff_ac[lVar45].fast[uVar63 >> 0x17];
                              if (uVar46 == 0xff) {
                                lVar53 = 0;
                                do {
                                  lVar67 = lVar53;
                                  lVar53 = lVar67 + 1;
                                } while ((uint)piVar73[lVar45 * 0x1a4 + lVar67 + -0x11] <=
                                         uVar63 >> 0x10);
                                iVar69 = psVar44->code_bits;
                                if (lVar53 == 8) {
                                  psVar44->code_bits = iVar69 + -0x10;
                                  uVar56 = 0xffffffff;
                                }
                                else {
                                  uVar56 = 0xffffffff;
                                  if ((int)(lVar67 + 10) <= iVar69) {
                                    uVar56 = stbi__bmask[lVar67 + 10];
                                    iVar42 = piVar73[lVar45 * 0x1a4 + lVar53];
                                    uVar54 = uVar63 << ((byte)(lVar67 + 10) & 0x1f);
                                    psVar44->code_bits = (iVar69 - (int)lVar53) + -9;
                                    psVar44->code_buffer = uVar54;
                                    uVar46 = (ulong)(int)((uVar63 >> (0x17U - (char)lVar53 & 0x1f) &
                                                          uVar56) + iVar42);
                                    goto LAB_0010ce62;
                                  }
                                }
                              }
                              else {
                                bVar2 = psVar44->huff_ac[lVar45].size[uVar46];
                                uVar56 = 0xffffffff;
                                if ((int)(uint)bVar2 <= psVar44->code_bits) {
                                  uVar54 = uVar63 << (bVar2 & 0x1f);
                                  psVar44->code_buffer = uVar54;
                                  psVar44->code_bits = psVar44->code_bits - (uint)bVar2;
LAB_0010ce62:
                                  uVar61 = (ulong)uVar54;
                                  uVar56 = (uint)psVar44->huff_ac[lVar45].values[uVar46];
                                }
                              }
                              if ((int)uVar56 < 0) {
                                stbi__g_failure_reason = "bad huffman code";
                                bVar76 = false;
                              }
                              else {
                                uVar63 = uVar56 >> 4;
                                if ((uVar56 & 0xf) == 1) {
                                  if (psVar44->code_bits < 1) {
                                    stbi__grow_buffer_unsafe(psVar44);
                                    uVar61 = extraout_RDX_04;
                                  }
                                  uVar56 = psVar44->code_buffer;
                                  psVar44->code_buffer = uVar56 * 2;
                                  psVar44->code_bits = psVar44->code_bits + -1;
                                  sVar60 = (short)(((int)~uVar56 >> 0x1f | 1U) << (bVar37 & 0x1f));
                                }
                                else {
                                  if ((uVar56 & 0xf) != 0) {
                                    stbi__g_failure_reason = "bad huffman code";
                                    bVar76 = false;
                                    goto LAB_0010d02f;
                                  }
                                  if (uVar56 < 0xf0) {
                                    psVar44->eob_run = ~(-1 << ((byte)uVar63 & 0x1f));
                                    uVar54 = 0x40;
                                    if (0xf < uVar56) {
                                      if (psVar44->code_bits < (int)uVar63) {
                                        stbi__grow_buffer_unsafe(psVar44);
                                      }
                                      bVar2 = (byte)uVar63 & 0x1f;
                                      uVar41 = psVar44->code_buffer << bVar2 |
                                               psVar44->code_buffer >> 0x20 - bVar2;
                                      uVar56 = stbi__bmask[uVar63];
                                      uVar55 = ~uVar56 & uVar41;
                                      uVar61 = (ulong)uVar55;
                                      psVar44->code_buffer = uVar55;
                                      psVar44->code_bits = psVar44->code_bits - uVar63;
                                      psVar44->eob_run = psVar44->eob_run + (uVar41 & uVar56);
                                    }
                                  }
                                  else {
                                    uVar54 = 0xf;
                                  }
                                  uVar63 = uVar54;
                                  sVar60 = 0;
                                }
                                uVar62 = (ulong)(int)uVar62;
                                do {
                                  if ((long)psVar44->spec_end < (long)uVar62) break;
                                  bVar2 = ""[uVar62];
                                  if (psVar66[bVar2] == 0) {
                                    if (uVar63 == 0) {
                                      psVar66[bVar2] = sVar60;
                                      bVar76 = false;
                                      uVar63 = 0;
                                    }
                                    else {
                                      uVar63 = uVar63 - 1;
                                      bVar76 = true;
                                    }
                                  }
                                  else {
                                    if (psVar44->code_bits < 1) {
                                      stbi__grow_buffer_unsafe(psVar44);
                                      uVar61 = extraout_RDX_05;
                                    }
                                    sVar40 = psVar44->code_buffer;
                                    psVar44->code_buffer = sVar40 * 2;
                                    psVar44->code_bits = psVar44->code_bits + -1;
                                    bVar76 = true;
                                    if (((int)sVar40 < 0) &&
                                       (sVar3 = psVar66[bVar2], (uVar74 & (int)sVar3) == 0)) {
                                      uVar56 = uVar74;
                                      if (sVar3 < 1) {
                                        uVar56 = -uVar74;
                                      }
                                      psVar66[bVar2] = sVar3 + (short)uVar56;
                                    }
                                  }
                                  uVar62 = uVar62 + 1;
                                } while (bVar76);
                                bVar76 = true;
                              }
LAB_0010d02f:
                              if (!bVar76) {
                                bVar76 = false;
                                goto LAB_0010d049;
                              }
                            } while ((int)uVar62 <= psVar44->spec_end);
                          }
                          else {
                            psVar44->eob_run = iVar69 + -1;
                            if (psVar44->spec_start <= psVar44->spec_end) {
                              uVar74 = (0x10000 << (bVar37 & 0x1f)) >> 0x10;
                              do {
                                bVar37 = ""[uVar62];
                                if (psVar66[bVar37] != 0) {
                                  if (psVar44->code_bits < 1) {
                                    stbi__grow_buffer_unsafe(psVar44);
                                    uVar61 = extraout_RDX_02;
                                  }
                                  sVar40 = psVar44->code_buffer;
                                  psVar44->code_buffer = sVar40 * 2;
                                  psVar44->code_bits = psVar44->code_bits + -1;
                                  if (((int)sVar40 < 0) &&
                                     (sVar60 = psVar66[bVar37], (uVar74 & (int)sVar60) == 0)) {
                                    uVar63 = -uVar74;
                                    if (0 < sVar60) {
                                      uVar63 = uVar74;
                                    }
                                    psVar66[bVar37] = (short)uVar63 + sVar60;
                                  }
                                }
                                bVar76 = (long)uVar62 < (long)psVar44->spec_end;
                                uVar62 = uVar62 + 1;
                              } while (bVar76);
                            }
                          }
LAB_0010d044:
                          bVar76 = true;
                        }
LAB_0010d049:
                        if (!bVar76) {
                          local_8978._0_4_ = 0;
                        }
                        local_8978 = (ulong)(uint)local_8978;
                        paVar58 = local_8910;
                        if (!bVar76) {
                          bVar76 = false;
                        }
                        else {
LAB_0010d06e:
                          iVar69 = psVar44->todo;
                          psVar44->todo = iVar69 + -1;
                          bVar76 = true;
                          if (iVar69 < 2) {
                            if (psVar44->code_bits < 0x18) {
                              stbi__grow_buffer_unsafe(psVar44);
                              uVar61 = extraout_RDX_06;
                            }
                            if ((psVar44->marker & 0xf8) == 0xd0) {
                              psVar44->code_buffer = 0;
                              psVar44->code_bits = 0;
                              psVar44->nomore = 0;
                              psVar44->img_comp[3].dc_pred = 0;
                              psVar44->img_comp[2].dc_pred = 0;
                              psVar44->img_comp[1].dc_pred = 0;
                              psVar44->img_comp[0].dc_pred = 0;
                              psVar44->marker = 0xff;
                              iVar69 = psVar44->restart_interval;
                              uVar61 = 0x7fffffff;
                              if (iVar69 == 0) {
                                iVar69 = 0x7fffffff;
                              }
                              psVar44->todo = iVar69;
                              psVar44->eob_run = 0;
                            }
                            else {
                              local_8978 = 1;
                              bVar76 = false;
                            }
                          }
                        }
                      }
                      uVar74 = (uint)uVar61;
                      if (!bVar76) {
                        iVar39 = (int)local_8978;
                        goto LAB_0010d9e0;
                      }
                      iVar39 = iVar39 + 1;
                    } while (iVar39 != iVar68);
                  }
                  uVar74 = (uint)uVar61;
                  iVar39 = 1;
                  iVar70 = iVar70 + 1;
                } while (iVar70 != (int)local_88f0);
              }
            }
            else {
              iVar39 = 1;
              if (0 < psVar44->img_mcu_y) {
                iVar39 = 0;
                do {
                  if (0 < psVar44->img_mcu_x) {
                    iVar70 = 0;
                    do {
                      if (0 < psVar44->scan_n) {
                        uVar62 = 0;
                        do {
                          local_89b0 = uVar62;
                          iVar68 = psVar44->order[local_89b0];
                          if (0 < psVar44->img_comp[iVar68].v) {
                            iVar69 = 0;
                            bVar76 = true;
                            do {
                              iVar42 = paVar1[iVar68].h;
                              if (0 < iVar42) {
                                iVar57 = 0;
                                do {
                                  iVar42 = stbi__jpeg_decode_block_prog_dc
                                                     (psVar44,paVar1[iVar68].coeff +
                                                              (iVar42 * iVar70 + iVar57 +
                                                              (paVar1[iVar68].v * iVar39 + iVar69) *
                                                              paVar1[iVar68].coeff_w) * 0x40,
                                                      (stbi__huffman *)
                                                      psVar44->huff_dc[paVar1[iVar68].hd].fast,
                                                      iVar68);
                                  uVar74 = (uint)extraout_RDX_10;
                                  uVar61 = extraout_RDX_10;
                                  if (iVar42 == 0) {
                                    if (bVar76) goto LAB_0010d9cd;
                                    goto LAB_0010d6dd;
                                  }
                                  iVar57 = iVar57 + 1;
                                  iVar42 = paVar1[iVar68].h;
                                } while (iVar57 < iVar42);
                              }
                              iVar69 = iVar69 + 1;
                              bVar76 = iVar69 < paVar1[iVar68].v;
                            } while (iVar69 < paVar1[iVar68].v);
                          }
LAB_0010d6dd:
                          uVar62 = local_89b0 + 1;
                        } while ((long)(local_89b0 + 1) < (long)psVar44->scan_n);
                      }
                      uVar74 = (uint)uVar61;
                      iVar68 = psVar44->todo;
                      psVar44->todo = iVar68 + -1;
                      if (iVar68 < 2) {
                        if (psVar44->code_bits < 0x18) {
                          stbi__grow_buffer_unsafe(psVar44);
                          uVar74 = extraout_EDX_01;
                        }
                        if ((psVar44->marker & 0xf8) != 0xd0) goto LAB_0010d79b;
                        psVar44->code_buffer = 0;
                        psVar44->code_bits = 0;
                        psVar44->nomore = 0;
                        psVar44->img_comp[3].dc_pred = 0;
                        psVar44->img_comp[2].dc_pred = 0;
                        psVar44->img_comp[1].dc_pred = 0;
                        psVar44->img_comp[0].dc_pred = 0;
                        psVar44->marker = 0xff;
                        iVar68 = psVar44->restart_interval;
                        uVar61 = 0x7fffffff;
                        if (iVar68 == 0) {
                          iVar68 = 0x7fffffff;
                        }
                        psVar44->todo = iVar68;
                        psVar44->eob_run = 0;
                      }
                      iVar70 = iVar70 + 1;
                    } while (iVar70 < psVar44->img_mcu_x);
                  }
                  uVar74 = (uint)uVar61;
                  iVar39 = iVar39 + 1;
                } while (iVar39 < psVar44->img_mcu_y);
                goto LAB_0010d79b;
              }
            }
            goto LAB_0010d9e0;
          }
          stbi__g_failure_reason = "bad SOS component count";
LAB_0010ea6d:
          uVar74 = (uint)paVar58;
        }
        else {
          if (bVar37 == 0xdc) {
            iVar39 = stbi__get16be(psVar44->s);
            sVar40 = stbi__get16be(psVar44->s);
            paVar58 = extraout_RDX;
            if (iVar39 == 4) {
              if (sVar40 == psVar44->s->img_y) goto LAB_0010d9f1;
              stbi__g_failure_reason = "bad DNL height";
            }
            else {
              stbi__g_failure_reason = "bad DNL len";
            }
            goto LAB_0010ea6d;
          }
          if (bVar37 == 0xd9) {
            if ((psVar44->progressive != 0) && (0 < psVar44->s->img_n)) {
              lVar45 = 0;
              do {
                iVar39 = psVar44->img_comp[lVar45].y + 7 >> 3;
                if (0 < iVar39) {
                  uVar74 = paVar1[lVar45].x + 7 >> 3;
                  iVar70 = 0;
                  do {
                    if (0 < (int)uVar74) {
                      uVar61 = 0;
                      do {
                        psVar66 = paVar1[lVar45].coeff +
                                  (paVar1[lVar45].coeff_w * iVar70 + (int)uVar61) * 0x40;
                        iVar68 = paVar1[lVar45].tq;
                        lVar53 = 0;
                        do {
                          psVar66[lVar53] = psVar66[lVar53] * psVar44->dequant[iVar68][lVar53];
                          lVar53 = lVar53 + 1;
                        } while (lVar53 != 0x40);
                        (*psVar44->idct_block_kernel)
                                  (paVar1[lVar45].data +
                                   uVar61 * 8 + (long)(iVar70 * 8 * paVar1[lVar45].w2),
                                   paVar1[lVar45].w2,psVar66);
                        uVar61 = uVar61 + 1;
                      } while (uVar61 != uVar74);
                    }
                    iVar70 = iVar70 + 1;
                  } while (iVar70 != iVar39);
                }
                lVar45 = lVar45 + 1;
              } while (lVar45 < psVar44->s->img_n);
            }
            if (req_comp == 0) {
              req_comp = (uint)(2 < psVar44->s->img_n) * 2 + 1;
            }
            uVar74 = psVar44->s->img_n;
            if (uVar74 == 3) {
              bVar76 = true;
              if (psVar44->rgb != 3) {
                if (psVar44->app14_color_transform != 0) goto LAB_0010e238;
                bVar76 = psVar44->jfif == 0;
              }
            }
            else {
LAB_0010e238:
              bVar76 = false;
            }
            uVar63 = 1;
            if (bVar76) {
              uVar63 = uVar74;
            }
            if (2 < req_comp) {
              uVar63 = uVar74;
            }
            if (uVar74 != 3) {
              uVar63 = uVar74;
            }
            if (0 < (int)uVar63) {
              lVar45 = 0;
              while( true ) {
                psVar47 = psVar44->s;
                sVar40 = psVar47->img_x;
                pvVar48 = malloc((ulong)(sVar40 + 3));
                *(void **)((long)&psVar44->img_comp[0].linebuf + lVar45 * 2) = pvVar48;
                if (pvVar48 == (void *)0x0) {
                  stbi__free_jpeg_components(psVar44,psVar47->img_n,why);
                  stbi__g_failure_reason = "outofmem";
                }
                else {
                  uVar61 = (long)psVar44->img_h_max /
                           (long)*(int *)((long)&psVar44->img_comp[0].h + lVar45 * 2);
                  iVar39 = (int)uVar61;
                  *(int *)((long)(local_88a8.pal + -7) + lVar45) = iVar39;
                  iVar70 = psVar44->img_v_max / *(int *)((long)&psVar44->img_comp[0].v + lVar45 * 2)
                  ;
                  *(int *)((long)(local_88a8.pal + -6) + lVar45) = iVar70;
                  *(int *)((long)(local_88a8.pal + -4) + lVar45) = iVar70 >> 1;
                  *(int *)((long)(local_88a8.pal + -5) + lVar45) =
                       (int)((ulong)((sVar40 + iVar39) - 1) / (uVar61 & 0xffffffff));
                  *(undefined4 *)((long)(local_88a8.pal + -3) + lVar45) = 0;
                  uVar7 = *(undefined8 *)((long)&psVar44->img_comp[0].data + lVar45 * 2);
                  *(undefined8 *)((long)(local_88a8.pal + -9) + lVar45) = uVar7;
                  *(undefined8 *)((long)(local_88a8.pal + -0xb) + lVar45) = uVar7;
                  if ((iVar39 == 1) && (iVar70 == 1)) {
                    pcVar49 = resample_row_1;
                  }
                  else if ((iVar39 == 1) && (iVar70 == 2)) {
                    pcVar49 = stbi__resample_row_v_2;
                  }
                  else if ((iVar39 == 2) && (iVar70 == 1)) {
                    pcVar49 = stbi__resample_row_h_2;
                  }
                  else if ((iVar39 == 2) && (iVar70 == 2)) {
                    pcVar49 = psVar44->resample_row_hv_2_kernel;
                  }
                  else {
                    pcVar49 = stbi__resample_row_generic;
                  }
                  *(code **)((long)&((stbi__gif *)(local_88a8.pal + -0xd))->w + lVar45) = pcVar49;
                }
                if (pvVar48 == (void *)0x0) break;
                lVar45 = lVar45 + 0x30;
                if ((ulong)uVar63 * 0x30 == lVar45) goto LAB_0010e39e;
              }
              goto LAB_0010ea84;
            }
LAB_0010e39e:
            psVar47 = psVar44->s;
            sVar40 = psVar47->img_y;
            psVar50 = (stbi__context *)stbi__malloc_mad3(req_comp,psVar47->img_x,sVar40,1);
            iVar39 = (int)extraout_RDX_13;
            if (psVar50 == (stbi__context *)0x0) {
              stbi__free_jpeg_components(psVar44,psVar47->img_n,iVar39);
              stbi__g_failure_reason = "outofmem";
              goto LAB_0010ea84;
            }
            if (sVar40 != 0) {
              iVar70 = 0;
              uVar74 = 0;
              uVar61 = extraout_RDX_13;
              do {
                sVar40 = psVar47->img_x;
                if (0 < (int)uVar63) {
                  pasVar72 = (stbi_uc (*) [4])&local_88a8.ratio;
                  uVar62 = 0;
                  piVar73 = &psVar44->img_comp[0].y;
                  do {
                    asVar4 = pasVar72[-1];
                    asVar5 = pasVar72[-3];
                    iVar39 = (int)asVar5 >> 1;
                    auVar116 = (**(code **)(pasVar72 + -10))
                                         (*(stbi_uc **)(piVar73 + 10),
                                          *(undefined8 *)
                                           (*pasVar72 +
                                           ((ulong)(iVar39 <= (int)asVar4) << 3 | 0xffffffffffffffe0
                                           )),*(undefined8 *)
                                               (*pasVar72 +
                                               ((ulong)((int)asVar4 < iVar39) << 3 |
                                               0xffffffffffffffe0)),pasVar72[-2]);
                    uVar61 = auVar116._8_8_;
                    *(long *)(&local_8948.bpp + uVar62 * 2) = auVar116._0_8_;
                    pasVar72[-1] = (stbi_uc  [4])((int)asVar4 + 1);
                    if ((int)asVar5 <= (int)asVar4 + 1) {
                      pasVar72[-1] = (stbi_uc  [4])0x0;
                      *(stbi_uc **)(pasVar72 + -8) = *(stbi_uc **)(pasVar72 + -6);
                      asVar4 = *pasVar72;
                      *pasVar72 = (stbi_uc  [4])((int)asVar4 + 1);
                      if ((int)asVar4 + 1 < *piVar73) {
                        *(stbi_uc **)(pasVar72 + -6) = *(stbi_uc **)(pasVar72 + -6) + piVar73[1];
                      }
                    }
                    uVar62 = uVar62 + 1;
                    piVar73 = piVar73 + 0x18;
                    pasVar72 = pasVar72 + 0xc;
                  } while (uVar63 != uVar62);
                }
                if (req_comp < 3) {
                  psVar47 = psVar44->s;
                  if (bVar76) {
                    if (req_comp == 1) {
                      if (psVar47->img_x != 0) {
                        uVar61 = CONCAT44(local_8948.mr,local_8948.hsz);
                        uVar62 = 0;
                        do {
                          bVar37 = *(byte *)(CONCAT44(local_8948.mb,local_8948.mg) + uVar62);
                          psVar50->buffer_start[uVar62 + sVar40 * iVar70 + -0x38] =
                               (stbi_uc)((uint)bVar37 * 2 + ((uint)bVar37 + (uint)bVar37 * 8) * 3 +
                                         (uint)*(byte *)(uVar61 + uVar62) * 0x96 +
                                         (uint)*(byte *)(CONCAT44(local_8948.offset,local_8948.bpp)
                                                        + uVar62) * 0x4d >> 8);
                          uVar62 = uVar62 + 1;
                        } while (uVar62 < psVar47->img_x);
                      }
                    }
                    else if (psVar47->img_x != 0) {
                      uVar61 = CONCAT44(local_8948.mr,local_8948.hsz);
                      uVar62 = 0;
                      do {
                        bVar37 = *(byte *)(CONCAT44(local_8948.mb,local_8948.mg) + uVar62);
                        psVar50->buffer_start[uVar62 * 2 + (ulong)(sVar40 * iVar70) + -0x38] =
                             (stbi_uc)((uint)bVar37 * 2 + ((uint)bVar37 + (uint)bVar37 * 8) * 3 +
                                       (uint)*(byte *)(uVar61 + uVar62) * 0x96 +
                                       (uint)*(byte *)(CONCAT44(local_8948.offset,local_8948.bpp) +
                                                      uVar62) * 0x4d >> 8);
                        psVar50->buffer_start[uVar62 * 2 + (ulong)(sVar40 * iVar70) + -0x37] = 0xff;
                        uVar62 = uVar62 + 1;
                      } while (uVar62 < psVar47->img_x);
                    }
                  }
                  else if (psVar47->img_n == 4) {
                    if (psVar44->app14_color_transform == 2) {
                      if (psVar47->img_x != 0) {
                        uVar61 = CONCAT44(local_8948.all_a,local_8948.ma);
                        psVar65 = psVar50->buffer_start + ((ulong)(sVar40 * iVar70) - 0x37);
                        uVar62 = 0;
                        do {
                          iVar39 = (*(byte *)(CONCAT44(local_8948.offset,local_8948.bpp) + uVar62) ^
                                   0xff) * (uint)*(byte *)(uVar61 + uVar62);
                          psVar65[-1] = (char)((iVar39 + 0x80U >> 8) + iVar39 + 0x80 >> 8);
                          *psVar65 = 0xff;
                          uVar62 = uVar62 + 1;
                          psVar65 = psVar65 + (uint)req_comp;
                        } while (uVar62 < psVar47->img_x);
                      }
                    }
                    else {
                      if (psVar44->app14_color_transform != 0) goto LAB_0010e7f1;
                      if (psVar47->img_x != 0) {
                        uVar61 = CONCAT44(local_8948.offset,local_8948.bpp);
                        psVar65 = psVar50->buffer_start + ((ulong)(sVar40 * iVar70) - 0x37);
                        uVar62 = 0;
                        do {
                          bVar37 = *(byte *)(CONCAT44(local_8948.all_a,local_8948.ma) + uVar62);
                          iVar68 = (uint)*(byte *)(uVar61 + uVar62) * (uint)bVar37;
                          iVar69 = (uint)*(byte *)(CONCAT44(local_8948.mr,local_8948.hsz) + uVar62)
                                   * (uint)bVar37;
                          iVar39 = (uint)*(byte *)(CONCAT44(local_8948.mb,local_8948.mg) + uVar62) *
                                   (uint)bVar37;
                          psVar65[-1] = (char)((iVar39 + (iVar39 + 0x80U >> 8) + 0x80 >> 8 & 0xff) *
                                               0x1d + (iVar69 + (iVar69 + 0x80U >> 8) + 0x80 >> 8 &
                                                      0xff) * 0x96 +
                                                      (iVar68 + (iVar68 + 0x80U >> 8) + 0x80 >> 8 &
                                                      0xff) * 0x4d >> 8);
                          *psVar65 = 0xff;
                          uVar62 = uVar62 + 1;
                          psVar65 = psVar65 + (uint)req_comp;
                        } while (uVar62 < psVar47->img_x);
                      }
                    }
                  }
                  else {
LAB_0010e7f1:
                    uVar56 = psVar47->img_x;
                    uVar61 = (ulong)uVar56;
                    if (req_comp == 1) {
                      if (uVar56 != 0) {
                        uVar61 = 0;
                        do {
                          psVar50->buffer_start[uVar61 + sVar40 * iVar70 + -0x38] =
                               *(stbi_uc *)(CONCAT44(local_8948.offset,local_8948.bpp) + uVar61);
                          uVar61 = uVar61 + 1;
                        } while (uVar61 < psVar47->img_x);
                      }
                    }
                    else if (uVar56 != 0) {
                      uVar61 = 0;
                      do {
                        psVar50->buffer_start[uVar61 * 2 + (ulong)(sVar40 * iVar70) + -0x38] =
                             *(stbi_uc *)(CONCAT44(local_8948.offset,local_8948.bpp) + uVar61);
                        psVar50->buffer_start[uVar61 * 2 + (ulong)(sVar40 * iVar70) + -0x37] = 0xff;
                        uVar61 = uVar61 + 1;
                      } while (uVar61 < psVar47->img_x);
                    }
                  }
                }
                else {
                  psVar65 = (stbi_uc *)CONCAT44(local_8948.offset,local_8948.bpp);
                  psVar47 = psVar44->s;
                  if (psVar47->img_n == 3) {
                    if (bVar76) {
                      if (psVar47->img_x != 0) {
                        uVar61 = CONCAT44(local_8948.mb,local_8948.mg);
                        psVar64 = psVar50->buffer_start + ((ulong)(sVar40 * iVar70) - 0x35);
                        uVar62 = 0;
                        do {
                          psVar64[-3] = psVar65[uVar62];
                          psVar64[-2] = *(undefined1 *)
                                         (CONCAT44(local_8948.mr,local_8948.hsz) + uVar62);
                          psVar64[-1] = *(undefined1 *)(uVar61 + uVar62);
                          *psVar64 = 0xff;
                          uVar62 = uVar62 + 1;
                          psVar64 = psVar64 + (uint)req_comp;
                        } while (uVar62 < psVar47->img_x);
                      }
                    }
                    else {
LAB_0010e864:
                      (*psVar44->YCbCr_to_RGB_kernel)
                                (psVar50->buffer_start +
                                 ((ulong)(uVar74 * req_comp * sVar40) - 0x38),psVar65,
                                 (stbi_uc *)CONCAT44(local_8948.mr,local_8948.hsz),
                                 (stbi_uc *)CONCAT44(local_8948.mb,local_8948.mg),psVar47->img_x,
                                 req_comp);
                      uVar61 = extraout_RDX_14;
                    }
                  }
                  else if (psVar47->img_n == 4) {
                    if (psVar44->app14_color_transform == 2) {
                      (*psVar44->YCbCr_to_RGB_kernel)
                                (psVar50->buffer_start +
                                 ((ulong)(uVar74 * req_comp * sVar40) - 0x38),psVar65,
                                 (stbi_uc *)CONCAT44(local_8948.mr,local_8948.hsz),
                                 (stbi_uc *)CONCAT44(local_8948.mb,local_8948.mg),psVar47->img_x,
                                 req_comp);
                      psVar47 = psVar44->s;
                      uVar61 = extraout_RDX_15;
                      if (psVar47->img_x != 0) {
                        psVar65 = psVar50->buffer_start + ((ulong)(sVar40 * iVar70) - 0x36);
                        uVar61 = 0;
                        do {
                          bVar37 = *(byte *)(CONCAT44(local_8948.all_a,local_8948.ma) + uVar61);
                          iVar39 = (psVar65[-2] ^ 0xff) * (uint)bVar37;
                          psVar65[-2] = (byte)((iVar39 + 0x80U >> 8) + iVar39 + 0x80 >> 8);
                          iVar39 = (psVar65[-1] ^ 0xff) * (uint)bVar37;
                          psVar65[-1] = (byte)((iVar39 + 0x80U >> 8) + iVar39 + 0x80 >> 8);
                          iVar39 = (*psVar65 ^ 0xff) * (uint)bVar37;
                          *psVar65 = (byte)((iVar39 + 0x80U >> 8) + iVar39 + 0x80 >> 8);
                          uVar61 = uVar61 + 1;
                          psVar65 = psVar65 + (uint)req_comp;
                        } while (uVar61 < psVar47->img_x);
                      }
                    }
                    else {
                      if (psVar44->app14_color_transform != 0) goto LAB_0010e864;
                      if (psVar47->img_x != 0) {
                        uVar61 = CONCAT44(local_8948.mr,local_8948.hsz);
                        psVar64 = psVar50->buffer_start + ((ulong)(sVar40 * iVar70) - 0x35);
                        uVar62 = 0;
                        do {
                          bVar37 = *(byte *)(CONCAT44(local_8948.all_a,local_8948.ma) + uVar62);
                          iVar39 = (uint)psVar65[uVar62] * (uint)bVar37;
                          psVar64[-3] = (char)((iVar39 + 0x80U >> 8) + iVar39 + 0x80 >> 8);
                          iVar39 = (uint)*(byte *)(uVar61 + uVar62) * (uint)bVar37;
                          psVar64[-2] = (char)((iVar39 + 0x80U >> 8) + iVar39 + 0x80 >> 8);
                          iVar39 = (uint)*(byte *)(CONCAT44(local_8948.mb,local_8948.mg) + uVar62) *
                                   (uint)bVar37;
                          psVar64[-1] = (char)((iVar39 + 0x80U >> 8) + iVar39 + 0x80 >> 8);
                          *psVar64 = 0xff;
                          uVar62 = uVar62 + 1;
                          psVar64 = psVar64 + (uint)req_comp;
                        } while (uVar62 < psVar47->img_x);
                      }
                    }
                  }
                  else if (psVar47->img_x != 0) {
                    psVar64 = psVar50->buffer_start + ((ulong)(sVar40 * iVar70) - 0x35);
                    uVar62 = 0;
                    do {
                      sVar36 = psVar65[uVar62];
                      psVar64[-1] = sVar36;
                      psVar64[-2] = sVar36;
                      psVar64[-3] = sVar36;
                      *psVar64 = 0xff;
                      uVar62 = uVar62 + 1;
                      uVar61 = (ulong)psVar47->img_x;
                      psVar64 = psVar64 + (uint)req_comp;
                    } while (uVar62 < uVar61);
                  }
                }
                iVar39 = (int)uVar61;
                uVar74 = uVar74 + 1;
                psVar47 = psVar44->s;
                iVar70 = iVar70 + req_comp;
              } while (uVar74 < psVar47->img_y);
            }
            stbi__free_jpeg_components(psVar44,psVar47->img_n,iVar39);
            psVar47 = psVar44->s;
            *x = psVar47->img_x;
            *y = psVar47->img_y;
            if (local_8920 != (int *)0x0) {
              *local_8920 = (uint)(2 < psVar47->img_n) * 2 + 1;
            }
            goto LAB_0010ea8a;
          }
          iVar39 = stbi__process_marker(psVar44,(uint)bVar37);
          uVar74 = extraout_EDX_00;
          if (iVar39 != 0) goto LAB_0010d9f1;
        }
      }
LAB_0010ea74:
      stbi__free_jpeg_components(psVar44,psVar44->s->img_n,uVar74);
    }
    else {
      stbi__g_failure_reason = "bad req_comp";
    }
LAB_0010ea84:
    psVar50 = (stbi__context *)0x0;
LAB_0010ea8a:
    free(psVar44);
  }
  else {
    iVar39 = stbi__check_png_header(s);
    psVar64 = s->img_buffer_original;
    s->img_buffer = psVar64;
    s->img_buffer_end = s->img_buffer_original_end;
    if (iVar39 != 0) {
      if ((uint)req_comp < 5) {
        local_88a8._0_8_ = s;
        iVar39 = stbi__parse_png_file((stbi__png *)&local_88a8,0,req_comp);
        data_00 = (stbi__uint16 *)local_88a8.history;
        uVar7 = local_88a8._0_8_;
        psVar75 = (stbi__uint16 *)0x0;
        if (iVar39 == 0) goto LAB_0010dcee;
        iVar39 = 8;
        if (8 < local_88a8.flags) {
          iVar39 = local_88a8.flags;
        }
        ri->bits_per_channel = iVar39;
        local_88a8.history = (stbi_uc *)0x0;
        if ((req_comp != 0) && (iVar39 = *(int *)(local_88a8._0_8_ + 0xc), iVar39 != req_comp)) {
          if (local_88a8.flags < 9) {
            data_00 = (stbi__uint16 *)
                      stbi__convert_format
                                ((uchar *)data_00,iVar39,req_comp,*(stbi__uint32 *)local_88a8._0_8_,
                                 *(stbi__uint32 *)(local_88a8._0_8_ + 4));
          }
          else {
            data_00 = stbi__convert_format16
                                (data_00,iVar39,req_comp,*(stbi__uint32 *)local_88a8._0_8_,
                                 *(stbi__uint32 *)(local_88a8._0_8_ + 4));
          }
          *(int *)(uVar7 + 0xc) = req_comp;
          if (data_00 == (stbi__uint16 *)0x0) goto LAB_0010c5bc;
        }
        *x = *(stbi__uint32 *)local_88a8._0_8_;
        *y = *(stbi__uint32 *)(local_88a8._0_8_ + 4);
        psVar75 = data_00;
        if (local_8920 != (int *)0x0) {
          *local_8920 = *(int *)(local_88a8._0_8_ + 8);
        }
LAB_0010dcee:
        free(local_88a8.history);
        local_88a8.history = (stbi_uc *)0x0;
        free(local_88a8.background);
        local_88a8.background = (stbi_uc *)0x0;
        free(local_88a8.out);
        return psVar75;
      }
      stbi__g_failure_reason = "bad req_comp";
      goto LAB_0010c5bc;
    }
    if (psVar64 < s->img_buffer_original_end) {
LAB_0010dc44:
      s->img_buffer = psVar64 + 1;
      if (*psVar64 != 'B') goto LAB_0010de90;
      psVar64 = s->img_buffer;
      if (s->img_buffer_end <= psVar64) {
        if (s->read_from_callbacks == 0) goto LAB_0010de90;
        psVar64 = s->buffer_start;
        iVar39 = (*(s->io).read)(s->io_user_data,(char *)psVar64,s->buflen);
        if (iVar39 == 0) {
          s->read_from_callbacks = 0;
          s->img_buffer = psVar64;
          s->img_buffer_end = s->buffer_start + 1;
          s->buffer_start[0] = '\0';
        }
        else {
          s->img_buffer = psVar64;
          s->img_buffer_end = psVar64 + iVar39;
        }
        psVar64 = s->img_buffer;
      }
      s->img_buffer = psVar64 + 1;
      if (*psVar64 != 'M') goto LAB_0010de90;
      stbi__get16le(s);
      stbi__get16le(s);
      stbi__get16le(s);
      stbi__get16le(s);
      stbi__get16le(s);
      stbi__get16le(s);
      uVar74 = stbi__get16le(s);
      iVar39 = stbi__get16le(s);
      uVar74 = iVar39 << 0x10 | uVar74;
      if ((((0x38 < uVar74) || ((0x100010000001000U >> ((ulong)uVar74 & 0x3f) & 1) == 0)) &&
          (uVar74 != 0x7c)) && (uVar74 != 0x6c)) goto LAB_0010de90;
      s->img_buffer = s->img_buffer_original;
      s->img_buffer_end = s->img_buffer_original_end;
      local_8948.all_a = 0xff;
      pvVar48 = stbi__bmp_parse_header(s,&local_8948);
      uVar74 = local_8948.all_a;
      if (pvVar48 == (void *)0x0) goto LAB_0010c5bc;
      local_88e0 = s->img_y;
      sVar40 = -local_88e0;
      if (0 < (int)local_88e0) {
        sVar40 = local_88e0;
      }
      s->img_y = sVar40;
      if (local_8948.hsz == 0xc) {
        if (local_8948.bpp < 0x18) {
          uVar63 = (local_8948.offset + -0x26) / 3;
        }
        else {
LAB_0010e03d:
          uVar63 = 0;
        }
      }
      else {
        if (0xf < local_8948.bpp) goto LAB_0010e03d;
        uVar63 = (local_8948.offset - local_8948.hsz) + -0xe >> 2;
      }
      iVar39 = 4 - (uint)(local_8948.ma == 0);
      s->img_n = iVar39;
      if (2 < req_comp) {
        iVar39 = req_comp;
      }
      b = s->img_x;
      iVar70 = stbi__mad3sizes_valid(iVar39,b,sVar40,0);
      if (iVar70 == 0) {
        stbi__g_failure_reason = "too large";
      }
      else {
        data_01 = (uchar *)stbi__malloc_mad3(iVar39,b,sVar40,0);
        if (data_01 == (uchar *)0x0) {
          stbi__g_failure_reason = "outofmem";
        }
        else {
          if (local_8948.bpp < 0x10) {
            if (0x100 < (int)uVar63 || uVar63 == 0) {
              free(data_01);
              stbi__g_failure_reason = "invalid";
              goto LAB_0010c5bc;
            }
            if (0 < (int)uVar63) {
              psVar65 = s->buffer_start;
              psVar64 = s->buffer_start + 1;
              uVar61 = 0;
              do {
                psVar51 = s->img_buffer;
                if (psVar51 < s->img_buffer_end) {
LAB_0010ec07:
                  s->img_buffer = psVar51 + 1;
                  sVar36 = *psVar51;
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    iVar70 = (*(s->io).read)(s->io_user_data,(char *)psVar65,s->buflen);
                    if (iVar70 == 0) {
                      s->read_from_callbacks = 0;
                      s->img_buffer = psVar65;
                      s->img_buffer_end = psVar64;
                      s->buffer_start[0] = '\0';
                    }
                    else {
                      s->img_buffer = psVar65;
                      s->img_buffer_end = psVar65 + iVar70;
                    }
                    psVar51 = s->img_buffer;
                    goto LAB_0010ec07;
                  }
                  sVar36 = '\0';
                }
                local_88a8.pal[uVar61 - 0xd][2] = sVar36;
                psVar51 = s->img_buffer;
                if (psVar51 < s->img_buffer_end) {
LAB_0010ec81:
                  s->img_buffer = psVar51 + 1;
                  sVar36 = *psVar51;
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    iVar70 = (*(s->io).read)(s->io_user_data,(char *)psVar65,s->buflen);
                    if (iVar70 == 0) {
                      s->read_from_callbacks = 0;
                      s->img_buffer = psVar65;
                      s->img_buffer_end = psVar64;
                      s->buffer_start[0] = '\0';
                    }
                    else {
                      s->img_buffer = psVar65;
                      s->img_buffer_end = psVar65 + iVar70;
                    }
                    psVar51 = s->img_buffer;
                    goto LAB_0010ec81;
                  }
                  sVar36 = '\0';
                }
                local_88a8.pal[uVar61 - 0xd][1] = sVar36;
                psVar51 = s->img_buffer;
                if (psVar51 < s->img_buffer_end) {
LAB_0010ecfb:
                  s->img_buffer = psVar51 + 1;
                  sVar36 = *psVar51;
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    iVar70 = (*(s->io).read)(s->io_user_data,(char *)psVar65,s->buflen);
                    if (iVar70 == 0) {
                      s->read_from_callbacks = 0;
                      s->img_buffer = psVar65;
                      s->img_buffer_end = psVar64;
                      s->buffer_start[0] = '\0';
                    }
                    else {
                      s->img_buffer = psVar65;
                      s->img_buffer_end = psVar65 + iVar70;
                    }
                    psVar51 = s->img_buffer;
                    goto LAB_0010ecfb;
                  }
                  sVar36 = '\0';
                }
                local_88a8.pal[uVar61 - 0xd][0] = sVar36;
                if (local_8948.hsz != 0xc) {
                  psVar51 = s->img_buffer;
                  if (s->img_buffer_end <= psVar51) {
                    if (s->read_from_callbacks == 0) goto LAB_0010ed81;
                    iVar70 = (*(s->io).read)(s->io_user_data,(char *)psVar65,s->buflen);
                    if (iVar70 == 0) {
                      s->read_from_callbacks = 0;
                      s->img_buffer = psVar65;
                      s->img_buffer_end = psVar64;
                      s->buffer_start[0] = '\0';
                    }
                    else {
                      s->img_buffer = psVar65;
                      s->img_buffer_end = psVar65 + iVar70;
                    }
                    psVar51 = s->img_buffer;
                  }
                  s->img_buffer = psVar51 + 1;
                }
LAB_0010ed81:
                local_88a8.pal[uVar61 - 0xd][3] = 0xff;
                uVar61 = uVar61 + 1;
              } while (uVar63 != uVar61);
            }
            stbi__skip(s,(uVar63 * (local_8948.hsz == 0xc | 0xfffffffc) - local_8948.hsz) +
                         local_8948.offset + -0xe);
            if (local_8948.bpp == 8) {
              uVar63 = s->img_x;
            }
            else if (local_8948.bpp == 4) {
              uVar63 = s->img_x + 1 >> 1;
            }
            else {
              if (local_8948.bpp != 1) {
                free(data_01);
                stbi__g_failure_reason = "bad bpp";
                goto LAB_0010c5bc;
              }
              uVar63 = s->img_x + 7 >> 3;
            }
            local_8990 = -uVar63 & 3;
            if (local_8948.bpp == 1) {
              if (0 < (int)s->img_y) {
                psVar65 = s->buffer_start;
                iVar68 = 0;
                iVar70 = 0;
                do {
                  pbVar52 = s->img_buffer;
                  if (pbVar52 < s->img_buffer_end) {
LAB_0010fd93:
                    s->img_buffer = pbVar52 + 1;
                    uVar63 = (uint)*pbVar52;
                  }
                  else {
                    if (s->read_from_callbacks != 0) {
                      iVar69 = (*(s->io).read)(s->io_user_data,(char *)psVar65,s->buflen);
                      if (iVar69 == 0) {
                        s->read_from_callbacks = 0;
                        s->img_buffer = psVar65;
                        s->img_buffer_end = s->buffer_start + 1;
                        s->buffer_start[0] = '\0';
                      }
                      else {
                        s->img_buffer = psVar65;
                        s->img_buffer_end = psVar65 + iVar69;
                      }
                      pbVar52 = s->img_buffer;
                      goto LAB_0010fd93;
                    }
                    uVar63 = 0;
                  }
                  if (0 < (int)s->img_x) {
                    puVar71 = data_01 + (long)iVar68 + 2;
                    iVar69 = 0;
                    uVar56 = 7;
                    do {
                      uVar61 = (ulong)((uVar63 >> (uVar56 & 0x1f) & 1) != 0);
                      puVar71[-2] = local_88a8.pal[uVar61 - 0xd][0];
                      puVar71[-1] = local_88a8.pal[uVar61 - 0xd][1];
                      *puVar71 = local_88a8.pal[uVar61 - 0xd][2];
                      if ((int)uVar56 < 1) {
                        pbVar52 = s->img_buffer;
                        if (pbVar52 < s->img_buffer_end) {
LAB_0010fe68:
                          s->img_buffer = pbVar52 + 1;
                          uVar63 = (uint)*pbVar52;
                        }
                        else {
                          if (s->read_from_callbacks != 0) {
                            iVar42 = (*(s->io).read)(s->io_user_data,(char *)psVar65,s->buflen);
                            if (iVar42 == 0) {
                              s->read_from_callbacks = 0;
                              s->img_buffer = psVar65;
                              s->img_buffer_end = s->buffer_start + 1;
                              s->buffer_start[0] = '\0';
                            }
                            else {
                              s->img_buffer = psVar65;
                              s->img_buffer_end = psVar65 + iVar42;
                            }
                            pbVar52 = s->img_buffer;
                            goto LAB_0010fe68;
                          }
                          uVar63 = 0;
                        }
                        uVar56 = 7;
                      }
                      else {
                        uVar56 = uVar56 - 1;
                      }
                      iVar69 = iVar69 + 1;
                      iVar68 = iVar68 + 3;
                      puVar71 = puVar71 + 3;
                    } while (iVar69 < (int)s->img_x);
                  }
                  stbi__skip(s,local_8990);
                  iVar70 = iVar70 + 1;
                } while (iVar70 < (int)s->img_y);
              }
            }
            else if (0 < (int)s->img_y) {
              psVar65 = s->buffer_start;
              uVar61 = 0;
              iVar70 = 0;
              do {
                if (0 < (int)s->img_x) {
                  iVar68 = 0;
                  do {
                    pbVar52 = s->img_buffer;
                    if (pbVar52 < s->img_buffer_end) {
LAB_0010ff85:
                      s->img_buffer = pbVar52 + 1;
                      uVar63 = (uint)*pbVar52;
                    }
                    else {
                      if (s->read_from_callbacks != 0) {
                        iVar69 = (*(s->io).read)(s->io_user_data,(char *)psVar65,s->buflen);
                        if (iVar69 == 0) {
                          s->read_from_callbacks = 0;
                          s->img_buffer = psVar65;
                          s->img_buffer_end = s->buffer_start + 1;
                          s->buffer_start[0] = '\0';
                        }
                        else {
                          s->img_buffer = psVar65;
                          s->img_buffer_end = psVar65 + iVar69;
                        }
                        pbVar52 = s->img_buffer;
                        goto LAB_0010ff85;
                      }
                      uVar63 = 0;
                    }
                    uVar56 = uVar63 >> 4;
                    if (local_8948.bpp != 4) {
                      uVar56 = uVar63;
                    }
                    uVar62 = (ulong)uVar56;
                    uVar63 = uVar63 & 0xf;
                    if (local_8948.bpp != 4) {
                      uVar63 = 0;
                    }
                    lVar45 = (long)(int)uVar61;
                    uVar46 = lVar45 + 3;
                    data_01[lVar45] = local_88a8.pal[uVar62 - 0xd][0];
                    data_01[lVar45 + 1] = local_88a8.pal[uVar62 - 0xd][1];
                    data_01[lVar45 + 2] = local_88a8.pal[uVar62 - 0xd][2];
                    if (iVar39 == 4) {
                      data_01[lVar45 + 3] = 0xff;
                      uVar46 = (ulong)((int)uVar61 + 4);
                    }
                    sVar40 = s->img_x;
                    if (iVar68 + 1U == sVar40) {
LAB_001100d5:
                      uVar61 = uVar46 & 0xffffffff;
                    }
                    else {
                      if (local_8948.bpp == 8) {
                        pbVar52 = s->img_buffer;
                        if (s->img_buffer_end <= pbVar52) {
                          if (s->read_from_callbacks == 0) {
                            uVar63 = 0;
                            goto LAB_00110090;
                          }
                          iVar69 = (*(s->io).read)(s->io_user_data,(char *)psVar65,s->buflen);
                          if (iVar69 == 0) {
                            s->read_from_callbacks = 0;
                            s->img_buffer = psVar65;
                            s->img_buffer_end = s->buffer_start + 1;
                            s->buffer_start[0] = '\0';
                          }
                          else {
                            s->img_buffer = psVar65;
                            s->img_buffer_end = psVar65 + iVar69;
                          }
                          pbVar52 = s->img_buffer;
                        }
                        s->img_buffer = pbVar52 + 1;
                        uVar63 = (uint)*pbVar52;
                      }
LAB_00110090:
                      lVar45 = (long)(int)uVar46;
                      uVar61 = lVar45 + 3;
                      uVar62 = (ulong)uVar63;
                      data_01[lVar45] = local_88a8.pal[uVar62 - 0xd][0];
                      data_01[lVar45 + 1] = local_88a8.pal[uVar62 - 0xd][1];
                      data_01[lVar45 + 2] = local_88a8.pal[uVar62 - 0xd][2];
                      if (iVar39 == 4) {
                        uVar46 = (ulong)((int)uVar46 + 4);
                        data_01[lVar45 + 3] = 0xff;
                        goto LAB_001100d5;
                      }
                    }
                  } while ((iVar68 + 1U != sVar40) && (iVar68 = iVar68 + 2, iVar68 < (int)s->img_x))
                  ;
                }
                stbi__skip(s,local_8990);
                iVar70 = iVar70 + 1;
              } while (iVar70 < (int)s->img_y);
            }
          }
          else {
            stbi__skip(s,(local_8948.offset - local_8948.hsz) + -0xe);
            if (local_8948.bpp == 0x18) {
              iVar70 = -3;
LAB_0010eea9:
              uVar63 = iVar70 * s->img_x & 3;
            }
            else {
              uVar63 = 0;
              if (local_8948.bpp == 0x10) {
                iVar70 = -2;
                goto LAB_0010eea9;
              }
            }
            iVar70 = 0;
            if (local_8948.bpp == 0x18) {
              uVar61 = 0;
LAB_0010ef03:
              local_8910 = (anon_struct_96_18_0d0905d3 *)((ulong)local_8910._4_4_ << 0x20);
            }
            else {
              uVar59 = (undefined7)((ulong)extraout_RDX_16 >> 8);
              if (local_8948.bpp != 0x20) {
                uVar61 = CONCAT71(uVar59,1);
                goto LAB_0010ef03;
              }
              uVar56 = local_8948.mr ^ 0xff0000 | local_8948.mg ^ 0xff00 | local_8948.mb ^ 0xff;
              local_8910 = (anon_struct_96_18_0d0905d3 *)
                           CONCAT44(local_8910._4_4_,
                                    CONCAT31((int3)(uVar56 >> 8),
                                             local_8948.ma == 0xff000000 && uVar56 == 0));
              uVar61 = CONCAT71(uVar59,local_8948.ma != 0xff000000 || uVar56 != 0);
            }
            iVar68 = 0;
            local_8964 = 0;
            local_8914 = 0;
            uVar54 = 0;
            uVar41 = 0;
            uVar55 = 0;
            uVar56 = 0;
            local_8904 = (uint)uVar61;
            if ((char)uVar61 == '\0') {
LAB_0010f0f7:
              bVar76 = true;
              if (0 < (int)s->img_y) {
                psVar65 = s->buffer_start;
                local_8900 = s->buffer_start + 1;
                local_88f8 = (int *)CONCAT44(local_88f8._4_4_,-iVar70);
                local_88e8 = CONCAT44(local_88e8._4_4_,8 - uVar54);
                local_88c4 = -iVar68;
                local_88c8 = 8 - uVar41;
                local_88cc = -local_8964;
                local_88d0 = 8 - uVar55;
                local_88d8 = -local_8914;
                local_88d4 = 8 - uVar56;
                iVar42 = 0;
                local_88f0 = (ulong)(uVar54 << 2);
                local_88b0 = (ulong)(uVar41 << 2);
                local_88b8 = (ulong)(uVar55 << 2);
                local_88c0 = (ulong)(uVar56 << 2);
                iVar69 = 0;
                local_8918 = uVar63;
                do {
                  local_88dc = iVar69;
                  if ((char)uVar61 == '\0') {
                    if (0 < (int)s->img_x) {
                      iVar69 = 0;
                      do {
                        puVar71 = s->img_buffer;
                        if (puVar71 < s->img_buffer_end) {
LAB_0010f3ea:
                          s->img_buffer = puVar71 + 1;
                          uVar38 = *puVar71;
                        }
                        else {
                          if (s->read_from_callbacks != 0) {
                            iVar57 = (*(s->io).read)(s->io_user_data,(char *)psVar65,s->buflen);
                            if (iVar57 == 0) {
                              s->read_from_callbacks = 0;
                              s->img_buffer = psVar65;
                              s->img_buffer_end = local_8900;
                              s->buffer_start[0] = '\0';
                            }
                            else {
                              s->img_buffer = psVar65;
                              s->img_buffer_end = psVar65 + iVar57;
                            }
                            puVar71 = s->img_buffer;
                            goto LAB_0010f3ea;
                          }
                          uVar38 = '\0';
                        }
                        data_01[(long)iVar42 + 2] = uVar38;
                        puVar71 = s->img_buffer;
                        if (puVar71 < s->img_buffer_end) {
LAB_0010f484:
                          s->img_buffer = puVar71 + 1;
                          uVar38 = *puVar71;
                        }
                        else {
                          if (s->read_from_callbacks != 0) {
                            iVar57 = (*(s->io).read)(s->io_user_data,(char *)psVar65,s->buflen);
                            if (iVar57 == 0) {
                              s->read_from_callbacks = 0;
                              s->img_buffer = psVar65;
                              s->img_buffer_end = local_8900;
                              s->buffer_start[0] = '\0';
                            }
                            else {
                              s->img_buffer = psVar65;
                              s->img_buffer_end = psVar65 + iVar57;
                            }
                            puVar71 = s->img_buffer;
                            goto LAB_0010f484;
                          }
                          uVar38 = '\0';
                        }
                        data_01[(long)iVar42 + 1] = uVar38;
                        puVar71 = s->img_buffer;
                        if (puVar71 < s->img_buffer_end) {
LAB_0010f51b:
                          s->img_buffer = puVar71 + 1;
                          uVar38 = *puVar71;
                        }
                        else {
                          if (s->read_from_callbacks != 0) {
                            iVar57 = (*(s->io).read)(s->io_user_data,(char *)psVar65,s->buflen);
                            if (iVar57 == 0) {
                              s->read_from_callbacks = 0;
                              s->img_buffer = psVar65;
                              s->img_buffer_end = local_8900;
                              s->buffer_start[0] = '\0';
                            }
                            else {
                              s->img_buffer = psVar65;
                              s->img_buffer_end = psVar65 + iVar57;
                            }
                            puVar71 = s->img_buffer;
                            goto LAB_0010f51b;
                          }
                          uVar38 = '\0';
                        }
                        data_01[iVar42] = uVar38;
                        bVar37 = 0xff;
                        if ((char)local_8910 != '\0') {
                          pbVar52 = s->img_buffer;
                          if (s->img_buffer_end <= pbVar52) {
                            if (s->read_from_callbacks == 0) {
                              bVar37 = 0;
                              goto LAB_0010f5ce;
                            }
                            iVar57 = (*(s->io).read)(s->io_user_data,(char *)psVar65,s->buflen);
                            if (iVar57 == 0) {
                              s->read_from_callbacks = 0;
                              s->img_buffer = psVar65;
                              s->img_buffer_end = local_8900;
                              s->buffer_start[0] = '\0';
                            }
                            else {
                              s->img_buffer = psVar65;
                              s->img_buffer_end = psVar65 + iVar57;
                            }
                            pbVar52 = s->img_buffer;
                          }
                          s->img_buffer = pbVar52 + 1;
                          bVar37 = *pbVar52;
                        }
LAB_0010f5ce:
                        iVar57 = iVar42 + 3;
                        if (iVar39 == 4) {
                          data_01[(long)iVar42 + 3] = bVar37;
                          iVar57 = iVar42 + 4;
                        }
                        iVar42 = iVar57;
                        uVar74 = uVar74 | bVar37;
                        iVar69 = iVar69 + 1;
                      } while (iVar69 < (int)s->img_x);
                    }
                  }
                  else if (0 < (int)s->img_x) {
                    iVar69 = 0;
                    do {
                      uVar63 = stbi__get16le(s);
                      if (local_8948.bpp != 0x10) {
                        iVar57 = stbi__get16le(s);
                        uVar63 = uVar63 | iVar57 << 0x10;
                      }
                      iVar57 = (int)(uVar63 & local_8948.mr) >> ((byte)iVar70 & 0x1f);
                      if (iVar70 < 0) {
                        iVar57 = (uVar63 & local_8948.mr) << ((byte)local_88f8 & 0x1f);
                      }
                      iVar115 = (int)(uVar63 & local_8948.mg) >> ((byte)iVar68 & 0x1f);
                      if (iVar68 < 0) {
                        iVar115 = (uVar63 & local_8948.mg) << ((byte)local_88c4 & 0x1f);
                      }
                      iVar43 = *(int *)(stbi__shiftsigned(int,int,int)::mul_table + local_88b0);
                      bVar37 = stbi__shiftsigned(int,int,int)::shift_table[local_88b0];
                      iVar29 = (int)(uVar63 & local_8948.mb) >> ((byte)local_8964 & 0x1f);
                      if (local_8964 < 0) {
                        iVar29 = (uVar63 & local_8948.mb) << ((byte)local_88cc & 0x1f);
                      }
                      iVar6 = *(int *)(stbi__shiftsigned(int,int,int)::mul_table + local_88b8);
                      bVar2 = stbi__shiftsigned(int,int,int)::shift_table[local_88b8];
                      data_01[iVar42] =
                           (uchar)((iVar57 >> ((byte)local_88e8 & 0x1f)) *
                                   *(int *)(stbi__shiftsigned(int,int,int)::mul_table + local_88f0)
                                  >> (stbi__shiftsigned(int,int,int)::shift_table[local_88f0] & 0x1f
                                     ));
                      data_01[(long)iVar42 + 1] =
                           (uchar)((iVar115 >> ((byte)local_88c8 & 0x1f)) * iVar43 >>
                                  (bVar37 & 0x1f));
                      data_01[(long)iVar42 + 2] =
                           (uchar)((iVar29 >> ((byte)local_88d0 & 0x1f)) * iVar6 >> (bVar2 & 0x1f));
                      if (local_8948.ma == 0) {
                        uVar63 = 0xff;
                      }
                      else {
                        iVar57 = (int)(uVar63 & local_8948.ma) >> ((byte)local_8914 & 0x1f);
                        if (local_8914 < 0) {
                          iVar57 = (uVar63 & local_8948.ma) << ((byte)local_88d8 & 0x1f);
                        }
                        uVar63 = (iVar57 >> ((byte)local_88d4 & 0x1f)) *
                                 *(int *)(stbi__shiftsigned(int,int,int)::mul_table + local_88c0) >>
                                 (stbi__shiftsigned(int,int,int)::shift_table[local_88c0] & 0x1f);
                      }
                      iVar57 = iVar42 + 3;
                      if (iVar39 == 4) {
                        data_01[(long)iVar42 + 3] = (uchar)uVar63;
                        iVar57 = iVar42 + 4;
                      }
                      iVar42 = iVar57;
                      uVar74 = uVar74 | uVar63;
                      iVar69 = iVar69 + 1;
                    } while (iVar69 < (int)s->img_x);
                  }
                  stbi__skip(s,local_8918);
                  iVar69 = local_88dc + 1;
                  uVar61 = (ulong)local_8904;
                } while (iVar69 < (int)s->img_y);
                bVar76 = true;
              }
            }
            else {
              if ((local_8948.mg != 0 && local_8948.mr != 0) && local_8948.mb != 0) {
                local_8918 = uVar63;
                iVar70 = stbi__high_bit(local_8948.mr);
                iVar70 = iVar70 + -7;
                uVar63 = (local_8948.mr >> 1 & 0x55555555) + (local_8948.mr & 0x55555555);
                uVar63 = (uVar63 >> 2 & 0x33333333) + (uVar63 & 0x33333333);
                uVar63 = (uVar63 >> 4) + uVar63 & 0xf0f0f0f;
                uVar63 = (uVar63 >> 8) + uVar63;
                uVar54 = (uVar63 >> 0x10) + uVar63 & 0xff;
                iVar68 = stbi__high_bit(local_8948.mg);
                iVar68 = iVar68 + -7;
                uVar63 = (local_8948.mg >> 1 & 0x55555555) + (local_8948.mg & 0x55555555);
                uVar63 = (uVar63 >> 2 & 0x33333333) + (uVar63 & 0x33333333);
                uVar63 = (uVar63 >> 4) + uVar63 & 0xf0f0f0f;
                uVar63 = (uVar63 >> 8) + uVar63;
                uVar41 = (uVar63 >> 0x10) + uVar63 & 0xff;
                local_8964 = stbi__high_bit(local_8948.mb);
                local_8964 = local_8964 + -7;
                uVar63 = (local_8948.mb >> 1 & 0x55555555) + (local_8948.mb & 0x55555555);
                uVar63 = (uVar63 >> 2 & 0x33333333) + (uVar63 & 0x33333333);
                uVar63 = (uVar63 >> 4) + uVar63 & 0xf0f0f0f;
                uVar63 = (uVar63 >> 8) + uVar63;
                uVar55 = (uVar63 >> 0x10) + uVar63 & 0xff;
                local_8914 = stbi__high_bit(local_8948.ma);
                uVar61 = (ulong)local_8904;
                local_8914 = local_8914 + -7;
                uVar63 = (local_8948.ma >> 1 & 0x55555555) + (local_8948.ma & 0x55555555);
                uVar63 = (uVar63 >> 2 & 0x33333333) + (uVar63 & 0x33333333);
                uVar63 = (uVar63 >> 4) + uVar63 & 0xf0f0f0f;
                uVar63 = (uVar63 >> 8) + uVar63;
                uVar56 = (uVar63 >> 0x10) + uVar63 & 0xff;
                uVar63 = local_8918;
                goto LAB_0010f0f7;
              }
              free(data_01);
              stbi__g_failure_reason = "bad masks";
              bVar76 = false;
            }
            if (!bVar76) goto LAB_0010c5bc;
          }
          piVar73 = local_8920;
          auVar35 = _DAT_001270f0;
          auVar34 = _DAT_001270e0;
          auVar33 = _DAT_001270d0;
          auVar32 = _DAT_001270c0;
          auVar31 = _DAT_00127070;
          auVar30 = _DAT_00127060;
          auVar116 = _DAT_00127050;
          if (((iVar39 == 4) && (uVar74 == 0)) &&
             (uVar74 = s->img_x * s->img_y * 4 - 1, -1 < (int)uVar74)) {
            uVar63 = uVar74 >> 2;
            auVar77._4_4_ = 0;
            auVar77._0_4_ = uVar63;
            auVar77._8_4_ = uVar63;
            auVar77._12_4_ = 0;
            puVar71 = data_01 + uVar74;
            uVar61 = 0;
            do {
              auVar95._8_4_ = (int)uVar61;
              auVar95._0_8_ = uVar61;
              auVar95._12_4_ = (int)(uVar61 >> 0x20);
              auVar97 = auVar77 | auVar30;
              auVar99 = (auVar95 | auVar116) ^ auVar30;
              iVar70 = auVar97._0_4_;
              iVar57 = -(uint)(iVar70 < auVar99._0_4_);
              iVar68 = auVar97._4_4_;
              auVar101._4_4_ = -(uint)(iVar68 < auVar99._4_4_);
              iVar69 = auVar97._8_4_;
              iVar115 = -(uint)(iVar69 < auVar99._8_4_);
              iVar42 = auVar97._12_4_;
              auVar101._12_4_ = -(uint)(iVar42 < auVar99._12_4_);
              auVar78._4_4_ = iVar57;
              auVar78._0_4_ = iVar57;
              auVar78._8_4_ = iVar115;
              auVar78._12_4_ = iVar115;
              auVar78 = pshuflw(in_XMM1,auVar78,0xe8);
              auVar100._4_4_ = -(uint)(auVar99._4_4_ == iVar68);
              auVar100._12_4_ = -(uint)(auVar99._12_4_ == iVar42);
              auVar100._0_4_ = auVar100._4_4_;
              auVar100._8_4_ = auVar100._12_4_;
              auVar87 = pshuflw(in_XMM2,auVar100,0xe8);
              auVar101._0_4_ = auVar101._4_4_;
              auVar101._8_4_ = auVar101._12_4_;
              auVar99 = pshuflw(auVar78,auVar101,0xe8);
              auVar97._8_4_ = 0xffffffff;
              auVar97._0_8_ = 0xffffffffffffffff;
              auVar97._12_4_ = 0xffffffff;
              auVar97 = (auVar99 | auVar87 & auVar78) ^ auVar97;
              auVar97 = packssdw(auVar97,auVar97);
              if ((auVar97 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *puVar71 = 0xff;
              }
              auVar87._4_4_ = iVar57;
              auVar87._0_4_ = iVar57;
              auVar87._8_4_ = iVar115;
              auVar87._12_4_ = iVar115;
              auVar101 = auVar100 & auVar87 | auVar101;
              auVar97 = packssdw(auVar101,auVar101);
              auVar99._8_4_ = 0xffffffff;
              auVar99._0_8_ = 0xffffffffffffffff;
              auVar99._12_4_ = 0xffffffff;
              auVar97 = packssdw(auVar97 ^ auVar99,auVar97 ^ auVar99);
              auVar97 = packsswb(auVar97,auVar97);
              if ((auVar97._0_4_ >> 8 & 1) != 0) {
                puVar71[-4] = 0xff;
              }
              auVar97 = (auVar95 | auVar31) ^ auVar30;
              auVar88._0_4_ = -(uint)(iVar70 < auVar97._0_4_);
              auVar88._4_4_ = -(uint)(iVar68 < auVar97._4_4_);
              auVar88._8_4_ = -(uint)(iVar69 < auVar97._8_4_);
              auVar88._12_4_ = -(uint)(iVar42 < auVar97._12_4_);
              auVar102._4_4_ = auVar88._0_4_;
              auVar102._0_4_ = auVar88._0_4_;
              auVar102._8_4_ = auVar88._8_4_;
              auVar102._12_4_ = auVar88._8_4_;
              iVar57 = -(uint)(auVar97._4_4_ == iVar68);
              iVar115 = -(uint)(auVar97._12_4_ == iVar42);
              auVar17._4_4_ = iVar57;
              auVar17._0_4_ = iVar57;
              auVar17._8_4_ = iVar115;
              auVar17._12_4_ = iVar115;
              auVar112._4_4_ = auVar88._4_4_;
              auVar112._0_4_ = auVar88._4_4_;
              auVar112._8_4_ = auVar88._12_4_;
              auVar112._12_4_ = auVar88._12_4_;
              auVar97 = auVar17 & auVar102 | auVar112;
              auVar97 = packssdw(auVar97,auVar97);
              auVar8._8_4_ = 0xffffffff;
              auVar8._0_8_ = 0xffffffffffffffff;
              auVar8._12_4_ = 0xffffffff;
              auVar97 = packssdw(auVar97 ^ auVar8,auVar97 ^ auVar8);
              auVar97 = packsswb(auVar97,auVar97);
              if ((auVar97._0_4_ >> 0x10 & 1) != 0) {
                puVar71[-8] = 0xff;
              }
              auVar97 = pshufhw(auVar97,auVar102,0x84);
              auVar18._4_4_ = iVar57;
              auVar18._0_4_ = iVar57;
              auVar18._8_4_ = iVar115;
              auVar18._12_4_ = iVar115;
              auVar99 = pshufhw(auVar88,auVar18,0x84);
              auVar78 = pshufhw(auVar97,auVar112,0x84);
              auVar79._8_4_ = 0xffffffff;
              auVar79._0_8_ = 0xffffffffffffffff;
              auVar79._12_4_ = 0xffffffff;
              auVar79 = (auVar78 | auVar99 & auVar97) ^ auVar79;
              auVar97 = packssdw(auVar79,auVar79);
              auVar97 = packsswb(auVar97,auVar97);
              if ((auVar97._0_4_ >> 0x18 & 1) != 0) {
                puVar71[-0xc] = 0xff;
              }
              auVar97 = (auVar95 | auVar35) ^ auVar30;
              auVar89._0_4_ = -(uint)(iVar70 < auVar97._0_4_);
              auVar89._4_4_ = -(uint)(iVar68 < auVar97._4_4_);
              auVar89._8_4_ = -(uint)(iVar69 < auVar97._8_4_);
              auVar89._12_4_ = -(uint)(iVar42 < auVar97._12_4_);
              auVar19._4_4_ = auVar89._0_4_;
              auVar19._0_4_ = auVar89._0_4_;
              auVar19._8_4_ = auVar89._8_4_;
              auVar19._12_4_ = auVar89._8_4_;
              auVar99 = pshuflw(auVar112,auVar19,0xe8);
              auVar80._0_4_ = -(uint)(auVar97._0_4_ == iVar70);
              auVar80._4_4_ = -(uint)(auVar97._4_4_ == iVar68);
              auVar80._8_4_ = -(uint)(auVar97._8_4_ == iVar69);
              auVar80._12_4_ = -(uint)(auVar97._12_4_ == iVar42);
              auVar103._4_4_ = auVar80._4_4_;
              auVar103._0_4_ = auVar80._4_4_;
              auVar103._8_4_ = auVar80._12_4_;
              auVar103._12_4_ = auVar80._12_4_;
              auVar97 = pshuflw(auVar80,auVar103,0xe8);
              auVar104._4_4_ = auVar89._4_4_;
              auVar104._0_4_ = auVar89._4_4_;
              auVar104._8_4_ = auVar89._12_4_;
              auVar104._12_4_ = auVar89._12_4_;
              auVar78 = pshuflw(auVar89,auVar104,0xe8);
              auVar9._8_4_ = 0xffffffff;
              auVar9._0_8_ = 0xffffffffffffffff;
              auVar9._12_4_ = 0xffffffff;
              auVar97 = packssdw(auVar97 & auVar99,(auVar78 | auVar97 & auVar99) ^ auVar9);
              auVar97 = packsswb(auVar97,auVar97);
              if ((auVar97 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                puVar71[-0x10] = 0xff;
              }
              auVar20._4_4_ = auVar89._0_4_;
              auVar20._0_4_ = auVar89._0_4_;
              auVar20._8_4_ = auVar89._8_4_;
              auVar20._12_4_ = auVar89._8_4_;
              auVar104 = auVar103 & auVar20 | auVar104;
              auVar78 = packssdw(auVar104,auVar104);
              auVar10._8_4_ = 0xffffffff;
              auVar10._0_8_ = 0xffffffffffffffff;
              auVar10._12_4_ = 0xffffffff;
              auVar97 = packssdw(auVar97,auVar78 ^ auVar10);
              auVar97 = packsswb(auVar97,auVar97);
              if ((auVar97._4_2_ >> 8 & 1) != 0) {
                puVar71[-0x14] = 0xff;
              }
              auVar97 = (auVar95 | auVar34) ^ auVar30;
              auVar90._0_4_ = -(uint)(iVar70 < auVar97._0_4_);
              auVar90._4_4_ = -(uint)(iVar68 < auVar97._4_4_);
              auVar90._8_4_ = -(uint)(iVar69 < auVar97._8_4_);
              auVar90._12_4_ = -(uint)(iVar42 < auVar97._12_4_);
              auVar105._4_4_ = auVar90._0_4_;
              auVar105._0_4_ = auVar90._0_4_;
              auVar105._8_4_ = auVar90._8_4_;
              auVar105._12_4_ = auVar90._8_4_;
              iVar57 = -(uint)(auVar97._4_4_ == iVar68);
              iVar115 = -(uint)(auVar97._12_4_ == iVar42);
              auVar21._4_4_ = iVar57;
              auVar21._0_4_ = iVar57;
              auVar21._8_4_ = iVar115;
              auVar21._12_4_ = iVar115;
              auVar113._4_4_ = auVar90._4_4_;
              auVar113._0_4_ = auVar90._4_4_;
              auVar113._8_4_ = auVar90._12_4_;
              auVar113._12_4_ = auVar90._12_4_;
              auVar97 = auVar21 & auVar105 | auVar113;
              auVar97 = packssdw(auVar97,auVar97);
              auVar11._8_4_ = 0xffffffff;
              auVar11._0_8_ = 0xffffffffffffffff;
              auVar11._12_4_ = 0xffffffff;
              auVar97 = packssdw(auVar97 ^ auVar11,auVar97 ^ auVar11);
              auVar97 = packsswb(auVar97,auVar97);
              if ((auVar97 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                puVar71[-0x18] = 0xff;
              }
              auVar97 = pshufhw(auVar97,auVar105,0x84);
              auVar22._4_4_ = iVar57;
              auVar22._0_4_ = iVar57;
              auVar22._8_4_ = iVar115;
              auVar22._12_4_ = iVar115;
              auVar99 = pshufhw(auVar90,auVar22,0x84);
              auVar78 = pshufhw(auVar97,auVar113,0x84);
              auVar81._8_4_ = 0xffffffff;
              auVar81._0_8_ = 0xffffffffffffffff;
              auVar81._12_4_ = 0xffffffff;
              auVar81 = (auVar78 | auVar99 & auVar97) ^ auVar81;
              auVar97 = packssdw(auVar81,auVar81);
              auVar97 = packsswb(auVar97,auVar97);
              if ((auVar97._6_2_ >> 8 & 1) != 0) {
                puVar71[-0x1c] = 0xff;
              }
              auVar97 = (auVar95 | auVar33) ^ auVar30;
              auVar91._0_4_ = -(uint)(iVar70 < auVar97._0_4_);
              auVar91._4_4_ = -(uint)(iVar68 < auVar97._4_4_);
              auVar91._8_4_ = -(uint)(iVar69 < auVar97._8_4_);
              auVar91._12_4_ = -(uint)(iVar42 < auVar97._12_4_);
              auVar23._4_4_ = auVar91._0_4_;
              auVar23._0_4_ = auVar91._0_4_;
              auVar23._8_4_ = auVar91._8_4_;
              auVar23._12_4_ = auVar91._8_4_;
              auVar99 = pshuflw(auVar113,auVar23,0xe8);
              auVar82._0_4_ = -(uint)(auVar97._0_4_ == iVar70);
              auVar82._4_4_ = -(uint)(auVar97._4_4_ == iVar68);
              auVar82._8_4_ = -(uint)(auVar97._8_4_ == iVar69);
              auVar82._12_4_ = -(uint)(auVar97._12_4_ == iVar42);
              auVar106._4_4_ = auVar82._4_4_;
              auVar106._0_4_ = auVar82._4_4_;
              auVar106._8_4_ = auVar82._12_4_;
              auVar106._12_4_ = auVar82._12_4_;
              auVar97 = pshuflw(auVar82,auVar106,0xe8);
              auVar107._4_4_ = auVar91._4_4_;
              auVar107._0_4_ = auVar91._4_4_;
              auVar107._8_4_ = auVar91._12_4_;
              auVar107._12_4_ = auVar91._12_4_;
              auVar78 = pshuflw(auVar91,auVar107,0xe8);
              auVar92._8_4_ = 0xffffffff;
              auVar92._0_8_ = 0xffffffffffffffff;
              auVar92._12_4_ = 0xffffffff;
              auVar92 = (auVar78 | auVar97 & auVar99) ^ auVar92;
              auVar78 = packssdw(auVar92,auVar92);
              auVar97 = packsswb(auVar97 & auVar99,auVar78);
              if ((auVar97 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                puVar71[-0x20] = 0xff;
              }
              auVar24._4_4_ = auVar91._0_4_;
              auVar24._0_4_ = auVar91._0_4_;
              auVar24._8_4_ = auVar91._8_4_;
              auVar24._12_4_ = auVar91._8_4_;
              auVar107 = auVar106 & auVar24 | auVar107;
              auVar78 = packssdw(auVar107,auVar107);
              auVar12._8_4_ = 0xffffffff;
              auVar12._0_8_ = 0xffffffffffffffff;
              auVar12._12_4_ = 0xffffffff;
              auVar78 = packssdw(auVar78 ^ auVar12,auVar78 ^ auVar12);
              auVar97 = packsswb(auVar97,auVar78);
              if ((auVar97._8_2_ >> 8 & 1) != 0) {
                puVar71[-0x24] = 0xff;
              }
              auVar97 = (auVar95 | auVar32) ^ auVar30;
              auVar93._0_4_ = -(uint)(iVar70 < auVar97._0_4_);
              auVar93._4_4_ = -(uint)(iVar68 < auVar97._4_4_);
              auVar93._8_4_ = -(uint)(iVar69 < auVar97._8_4_);
              auVar93._12_4_ = -(uint)(iVar42 < auVar97._12_4_);
              auVar108._4_4_ = auVar93._0_4_;
              auVar108._0_4_ = auVar93._0_4_;
              auVar108._8_4_ = auVar93._8_4_;
              auVar108._12_4_ = auVar93._8_4_;
              iVar57 = -(uint)(auVar97._4_4_ == iVar68);
              iVar115 = -(uint)(auVar97._12_4_ == iVar42);
              auVar25._4_4_ = iVar57;
              auVar25._0_4_ = iVar57;
              auVar25._8_4_ = iVar115;
              auVar25._12_4_ = iVar115;
              auVar114._4_4_ = auVar93._4_4_;
              auVar114._0_4_ = auVar93._4_4_;
              auVar114._8_4_ = auVar93._12_4_;
              auVar114._12_4_ = auVar93._12_4_;
              auVar97 = auVar25 & auVar108 | auVar114;
              auVar97 = packssdw(auVar97,auVar97);
              auVar13._8_4_ = 0xffffffff;
              auVar13._0_8_ = 0xffffffffffffffff;
              auVar13._12_4_ = 0xffffffff;
              auVar97 = packssdw(auVar97 ^ auVar13,auVar97 ^ auVar13);
              auVar97 = packsswb(auVar97,auVar97);
              if ((auVar97 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                puVar71[-0x28] = 0xff;
              }
              auVar97 = pshufhw(auVar97,auVar108,0x84);
              auVar26._4_4_ = iVar57;
              auVar26._0_4_ = iVar57;
              auVar26._8_4_ = iVar115;
              auVar26._12_4_ = iVar115;
              auVar99 = pshufhw(auVar93,auVar26,0x84);
              auVar78 = pshufhw(auVar97,auVar114,0x84);
              auVar83._8_4_ = 0xffffffff;
              auVar83._0_8_ = 0xffffffffffffffff;
              auVar83._12_4_ = 0xffffffff;
              auVar83 = (auVar78 | auVar99 & auVar97) ^ auVar83;
              auVar97 = packssdw(auVar83,auVar83);
              auVar97 = packsswb(auVar97,auVar97);
              if ((auVar97._10_2_ >> 8 & 1) != 0) {
                puVar71[-0x2c] = 0xff;
              }
              auVar97 = (auVar95 | _DAT_001270b0) ^ auVar30;
              auVar94._0_4_ = -(uint)(iVar70 < auVar97._0_4_);
              auVar94._4_4_ = -(uint)(iVar68 < auVar97._4_4_);
              auVar94._8_4_ = -(uint)(iVar69 < auVar97._8_4_);
              auVar94._12_4_ = -(uint)(iVar42 < auVar97._12_4_);
              auVar27._4_4_ = auVar94._0_4_;
              auVar27._0_4_ = auVar94._0_4_;
              auVar27._8_4_ = auVar94._8_4_;
              auVar27._12_4_ = auVar94._8_4_;
              auVar99 = pshuflw(auVar114,auVar27,0xe8);
              auVar84._0_4_ = -(uint)(auVar97._0_4_ == iVar70);
              auVar84._4_4_ = -(uint)(auVar97._4_4_ == iVar68);
              auVar84._8_4_ = -(uint)(auVar97._8_4_ == iVar69);
              auVar84._12_4_ = -(uint)(auVar97._12_4_ == iVar42);
              auVar109._4_4_ = auVar84._4_4_;
              auVar109._0_4_ = auVar84._4_4_;
              auVar109._8_4_ = auVar84._12_4_;
              auVar109._12_4_ = auVar84._12_4_;
              auVar97 = pshuflw(auVar84,auVar109,0xe8);
              auVar110._4_4_ = auVar94._4_4_;
              auVar110._0_4_ = auVar94._4_4_;
              auVar110._8_4_ = auVar94._12_4_;
              auVar110._12_4_ = auVar94._12_4_;
              auVar78 = pshuflw(auVar94,auVar110,0xe8);
              auVar14._8_4_ = 0xffffffff;
              auVar14._0_8_ = 0xffffffffffffffff;
              auVar14._12_4_ = 0xffffffff;
              auVar97 = packssdw(auVar97 & auVar99,(auVar78 | auVar97 & auVar99) ^ auVar14);
              auVar97 = packsswb(auVar97,auVar97);
              if ((auVar97 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                puVar71[-0x30] = 0xff;
              }
              auVar28._4_4_ = auVar94._0_4_;
              auVar28._0_4_ = auVar94._0_4_;
              auVar28._8_4_ = auVar94._8_4_;
              auVar28._12_4_ = auVar94._8_4_;
              auVar110 = auVar109 & auVar28 | auVar110;
              auVar78 = packssdw(auVar110,auVar110);
              auVar15._8_4_ = 0xffffffff;
              auVar15._0_8_ = 0xffffffffffffffff;
              auVar15._12_4_ = 0xffffffff;
              auVar97 = packssdw(auVar97,auVar78 ^ auVar15);
              auVar97 = packsswb(auVar97,auVar97);
              if ((auVar97._12_2_ >> 8 & 1) != 0) {
                puVar71[-0x34] = 0xff;
              }
              auVar97 = (auVar95 | _DAT_001270a0) ^ auVar30;
              auVar85._0_4_ = -(uint)(iVar70 < auVar97._0_4_);
              auVar85._4_4_ = -(uint)(iVar68 < auVar97._4_4_);
              auVar85._8_4_ = -(uint)(iVar69 < auVar97._8_4_);
              auVar85._12_4_ = -(uint)(iVar42 < auVar97._12_4_);
              auVar111._4_4_ = auVar85._0_4_;
              auVar111._0_4_ = auVar85._0_4_;
              auVar111._8_4_ = auVar85._8_4_;
              auVar111._12_4_ = auVar85._8_4_;
              auVar96._4_4_ = -(uint)(auVar97._4_4_ == iVar68);
              auVar96._12_4_ = -(uint)(auVar97._12_4_ == iVar42);
              auVar96._0_4_ = auVar96._4_4_;
              auVar96._8_4_ = auVar96._12_4_;
              auVar98._4_4_ = auVar85._4_4_;
              auVar98._0_4_ = auVar85._4_4_;
              auVar98._8_4_ = auVar85._12_4_;
              auVar98._12_4_ = auVar85._12_4_;
              auVar78 = auVar96 & auVar111 | auVar98;
              auVar97 = packssdw(auVar85,auVar78);
              auVar16._8_4_ = 0xffffffff;
              auVar16._0_8_ = 0xffffffffffffffff;
              auVar16._12_4_ = 0xffffffff;
              auVar97 = packssdw(auVar97 ^ auVar16,auVar97 ^ auVar16);
              auVar97 = packsswb(auVar97,auVar97);
              if ((auVar97 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                puVar71[-0x38] = 0xff;
              }
              auVar97 = pshufhw(auVar97,auVar111,0x84);
              in_XMM2 = pshufhw(auVar78,auVar96,0x84);
              in_XMM2 = in_XMM2 & auVar97;
              auVar97 = pshufhw(auVar97,auVar98,0x84);
              auVar86._8_4_ = 0xffffffff;
              auVar86._0_8_ = 0xffffffffffffffff;
              auVar86._12_4_ = 0xffffffff;
              auVar86 = (auVar97 | in_XMM2) ^ auVar86;
              auVar97 = packssdw(auVar86,auVar86);
              in_XMM1 = packsswb(auVar97,auVar97);
              if ((in_XMM1._14_2_ >> 8 & 1) != 0) {
                puVar71[-0x3c] = 0xff;
              }
              uVar61 = uVar61 + 0x10;
              puVar71 = puVar71 + -0x40;
            } while ((uVar63 + 0x10 & 0x3ffffff0) != uVar61);
          }
          if (0 < (int)local_88e0) {
            uVar74 = (int)s->img_y >> 1;
            if (0 < (int)uVar74) {
              uVar56 = s->img_x * iVar39;
              uVar63 = (s->img_y - 1) * uVar56;
              uVar61 = 0;
              uVar62 = 0;
              do {
                if (0 < (int)uVar56) {
                  uVar46 = 0;
                  do {
                    uVar38 = data_01[uVar46 + uVar61];
                    data_01[uVar46 + uVar61] = data_01[uVar46 + uVar63];
                    data_01[uVar46 + uVar63] = uVar38;
                    uVar46 = uVar46 + 1;
                  } while (uVar56 != uVar46);
                }
                uVar62 = uVar62 + 1;
                uVar63 = uVar63 - uVar56;
                uVar61 = (ulong)((int)uVar61 + uVar56);
              } while (uVar62 != uVar74);
            }
          }
          if (((req_comp == 0) || (iVar39 == req_comp)) ||
             (data_01 = stbi__convert_format(data_01,iVar39,req_comp,s->img_x,s->img_y),
             data_01 != (uchar *)0x0)) {
            *x = s->img_x;
            *y = s->img_y;
            if (piVar73 == (int *)0x0) {
              return data_01;
            }
            *piVar73 = s->img_n;
            return data_01;
          }
        }
      }
    }
    else {
      if (s->read_from_callbacks != 0) {
        psVar64 = s->buffer_start;
        iVar39 = (*(s->io).read)(s->io_user_data,(char *)psVar64,s->buflen);
        if (iVar39 == 0) {
          s->read_from_callbacks = 0;
          s->img_buffer = psVar64;
          s->img_buffer_end = s->buffer_start + 1;
          s->buffer_start[0] = '\0';
        }
        else {
          s->img_buffer = psVar64;
          s->img_buffer_end = psVar64 + iVar39;
        }
        psVar64 = s->img_buffer;
        goto LAB_0010dc44;
      }
LAB_0010de90:
      s->img_buffer = s->img_buffer_original;
      s->img_buffer_end = s->img_buffer_original_end;
      iVar39 = stbi__gif_test(s);
      if (iVar39 != 0) {
        memset(&local_88a8,0,0x8870);
        psVar47 = (stbi__context *)stbi__gif_load_next(s,&local_88a8,local_8920,0,psVar65);
        if (psVar47 == s) {
          psVar47 = (stbi__context *)0x0;
        }
        psVar50 = (stbi__context *)0x0;
        if (psVar47 != (stbi__context *)0x0) {
          *x = local_88a8.w;
          *y = local_88a8.h;
          psVar50 = psVar47;
          if ((req_comp & 0xfffffffbU) != 0) {
            psVar50 = (stbi__context *)
                      stbi__convert_format((uchar *)psVar47,4,req_comp,local_88a8.w,local_88a8.h);
          }
        }
        free(local_88a8.history);
        psVar44 = (stbi__jpeg *)local_88a8.background;
        goto LAB_0010ea8a;
      }
      iVar39 = stbi__psd_test(s);
      if (iVar39 != 0) {
        pvVar48 = stbi__psd_load(s,x,y,local_8920,req_comp,ri,bpc);
        return pvVar48;
      }
      iVar39 = stbi__pic_test(s);
      if (iVar39 != 0) {
        pvVar48 = stbi__pic_load(s,x,y,local_8920,req_comp,ri_00);
        return pvVar48;
      }
      iVar39 = stbi__pnm_test(s);
      piVar73 = local_8920;
      if (iVar39 != 0) {
        pvVar48 = stbi__pnm_load(s,x,y,local_8920,req_comp,ri_00);
        return pvVar48;
      }
      iVar39 = stbi__hdr_test(s);
      if (iVar39 != 0) {
        data_02 = stbi__hdr_load(s,x,y,piVar73,req_comp,ri_00);
        if (req_comp == 0) {
          req_comp = *piVar73;
        }
        psVar65 = stbi__hdr_to_ldr(data_02,*x,*y,req_comp);
        return psVar65;
      }
      iVar39 = stbi__tga_test(s);
      if (iVar39 != 0) {
        pvVar48 = stbi__tga_load(s,x,y,piVar73,req_comp,ri_00);
        return pvVar48;
      }
      stbi__g_failure_reason = "unknown image type";
    }
LAB_0010c5bc:
    psVar50 = (stbi__context *)0x0;
  }
  return psVar50;
LAB_0010d9cd:
  iVar39 = 0;
LAB_0010d9e0:
  if (iVar39 == 0) goto LAB_0010ea74;
  if (psVar44->marker != 0xff) goto LAB_0010d9f1;
LAB_0010d9fb:
  do {
    psVar47 = psVar44->s;
    if ((psVar47->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_0010da1b:
      if (psVar47->img_buffer_end <= psVar47->img_buffer) goto LAB_0010d9f1;
    }
    else {
      iVar39 = (*(psVar47->io).eof)(psVar47->io_user_data);
      if (iVar39 != 0) {
        if (psVar47->read_from_callbacks != 0) goto LAB_0010da1b;
        goto LAB_0010d9f1;
      }
    }
    psVar47 = psVar44->s;
    psVar65 = psVar47->img_buffer;
    if (psVar47->img_buffer_end <= psVar65) {
      if (psVar47->read_from_callbacks == 0) goto LAB_0010d9fb;
      psVar65 = psVar47->buffer_start;
      iVar39 = (*(psVar47->io).read)(psVar47->io_user_data,(char *)psVar65,psVar47->buflen);
      if (iVar39 == 0) {
        psVar47->read_from_callbacks = 0;
        psVar47->img_buffer = psVar65;
        psVar47->img_buffer_end = psVar47->buffer_start + 1;
        psVar47->buffer_start[0] = '\0';
      }
      else {
        psVar47->img_buffer = psVar65;
        psVar47->img_buffer_end = psVar65 + iVar39;
      }
      psVar65 = psVar47->img_buffer;
    }
    psVar47->img_buffer = psVar65 + 1;
  } while (*psVar65 != 0xff);
  psVar47 = psVar44->s;
  psVar65 = psVar47->img_buffer;
  if (psVar65 < psVar47->img_buffer_end) {
LAB_0010db25:
    psVar47->img_buffer = psVar65 + 1;
    sVar36 = *psVar65;
  }
  else {
    if (psVar47->read_from_callbacks != 0) {
      psVar65 = psVar47->buffer_start;
      iVar39 = (*(psVar47->io).read)(psVar47->io_user_data,(char *)psVar65,psVar47->buflen);
      if (iVar39 == 0) {
        psVar47->read_from_callbacks = 0;
        psVar47->img_buffer = psVar65;
        psVar47->img_buffer_end = psVar47->buffer_start + 1;
        psVar47->buffer_start[0] = '\0';
      }
      else {
        psVar47->img_buffer = psVar65;
        psVar47->img_buffer_end = psVar65 + iVar39;
      }
      psVar65 = psVar47->img_buffer;
      goto LAB_0010db25;
    }
    sVar36 = '\0';
  }
  psVar44->marker = sVar36;
LAB_0010d9f1:
  bVar37 = stbi__get_marker(psVar44);
  goto LAB_0010c656;
}

Assistant:

static void *stbi__load_main(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri, int bpc)
{
   memset(ri, 0, sizeof(*ri)); // make sure it's initialized if we add new fields
   ri->bits_per_channel = 8; // default is 8 so most paths don't have to be changed
   ri->channel_order = STBI_ORDER_RGB; // all current input & output are this, but this is here so we can add BGR order
   ri->num_channels = 0;

   #ifndef STBI_NO_JPEG
   if (stbi__jpeg_test(s)) return stbi__jpeg_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNG
   if (stbi__png_test(s))  return stbi__png_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_BMP
   if (stbi__bmp_test(s))  return stbi__bmp_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_GIF
   if (stbi__gif_test(s))  return stbi__gif_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PSD
   if (stbi__psd_test(s))  return stbi__psd_load(s,x,y,comp,req_comp, ri, bpc);
   #endif
   #ifndef STBI_NO_PIC
   if (stbi__pic_test(s))  return stbi__pic_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNM
   if (stbi__pnm_test(s))  return stbi__pnm_load(s,x,y,comp,req_comp, ri);
   #endif

   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      float *hdr = stbi__hdr_load(s, x,y,comp,req_comp, ri);
      return stbi__hdr_to_ldr(hdr, *x, *y, req_comp ? req_comp : *comp);
   }
   #endif

   #ifndef STBI_NO_TGA
   // test tga last because it's a crappy test!
   if (stbi__tga_test(s))
      return stbi__tga_load(s,x,y,comp,req_comp, ri);
   #endif

   return stbi__errpuc("unknown image type", "Image not of any known type, or corrupt");
}